

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vfloat_impl<4> vVar46;
  int iVar47;
  undefined4 uVar48;
  StackEntry *pSVar50;
  ulong extraout_RAX;
  RTCRayN *pRVar52;
  undefined4 uVar49;
  ulong extraout_RAX_00;
  int iVar53;
  RTCFilterFunctionN p_Var54;
  RTCFilterFunctionN p_Var55;
  RTCFilterFunctionN extraout_RDX;
  RTCFilterFunctionN extraout_RDX_00;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  RTCFilterFunctionN p_Var59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  float fVar101;
  float fVar102;
  __m128 a_1;
  undefined1 auVar68 [16];
  undefined2 uVar100;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar103;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar99;
  short sVar104;
  float pp;
  float fVar105;
  float fVar140;
  float fVar141;
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar150;
  float fVar152;
  vfloat4 a;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  float fVar156;
  float fVar172;
  float fVar174;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar196;
  float fVar198;
  vfloat4 v;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  float fVar202;
  float fVar210;
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar213;
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar215;
  float fVar216;
  float fVar233;
  float fVar235;
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  float fVar249;
  float fVar251;
  undefined1 auVar240 [16];
  float fVar239;
  float fVar250;
  float fVar252;
  float fVar253;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  float fVar254;
  float fVar255;
  uint uVar256;
  float fVar267;
  float fVar270;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar268;
  float fVar271;
  float fVar273;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  uint uVar269;
  uint uVar272;
  undefined1 auVar264 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar265;
  undefined1 auVar266 [16];
  float fVar274;
  float fVar275;
  float fVar280;
  float fVar284;
  undefined1 auVar276 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar291;
  float fVar292;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar324;
  float fVar327;
  undefined1 auVar319 [16];
  float fVar330;
  undefined1 auVar322 [16];
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar331;
  float fVar332;
  undefined1 auVar323 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar338;
  float fVar341;
  float fVar344;
  undefined1 auVar336 [16];
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar343;
  float fVar345;
  float fVar346;
  undefined1 auVar337 [16];
  float fVar347;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar354;
  float fVar361;
  float fVar362;
  __m128 a_2;
  float fVar363;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  uint local_6ac;
  undefined8 local_6a8;
  undefined8 local_678;
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5f8 [16];
  ulong local_5e0;
  RTCFilterFunctionNArguments args;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  Vec3fa dir;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  ulong uVar51;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 uVar139;
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  
  PVar8 = prim[1];
  uVar57 = (ulong)(byte)PVar8;
  pPVar5 = prim + uVar57 * 0x19 + 6;
  fVar174 = *(float *)(pPVar5 + 0xc);
  uVar49 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar177 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar174;
  fVar196 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar174;
  fVar198 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar174;
  fVar155 = *(float *)(ray + k * 4 + 0x40) * fVar174;
  fVar172 = *(float *)(ray + k * 4 + 0x50) * fVar174;
  fVar174 = *(float *)(ray + k * 4 + 0x60) * fVar174;
  uVar48 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar58;
  auVar108._12_2_ = uVar100;
  auVar108._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar58;
  auVar107._10_2_ = uVar100;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar100;
  auVar106._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar29._4_8_ = auVar106._8_8_;
  auVar29._2_2_ = uVar100;
  auVar29._0_2_ = uVar100;
  fVar142 = (float)((int)sVar104 >> 8);
  fVar150 = (float)(auVar29._0_4_ >> 0x18);
  fVar152 = (float)(auVar106._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar58;
  auVar111._12_2_ = uVar100;
  auVar111._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar58;
  auVar110._10_2_ = uVar100;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar100;
  auVar109._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar30._4_8_ = auVar109._8_8_;
  auVar30._2_2_ = uVar100;
  auVar30._0_2_ = uVar100;
  fVar201 = (float)((int)sVar104 >> 8);
  fVar210 = (float)(auVar30._0_4_ >> 0x18);
  fVar212 = (float)(auVar109._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._12_2_ = uVar100;
  auVar114._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar58;
  auVar113._10_2_ = uVar100;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar100;
  auVar112._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar31._4_8_ = auVar112._8_8_;
  auVar31._2_2_ = uVar100;
  auVar31._0_2_ = uVar100;
  fVar254 = (float)((int)sVar104 >> 8);
  fVar267 = (float)(auVar31._0_4_ >> 0x18);
  fVar270 = (float)(auVar112._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0xb + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar58;
  auVar117._12_2_ = uVar100;
  auVar117._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar58;
  auVar116._10_2_ = uVar100;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar100;
  auVar115._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar32._4_8_ = auVar115._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar67 = (float)((int)sVar104 >> 8);
  fVar101 = (float)(auVar32._0_4_ >> 0x18);
  fVar102 = (float)(auVar115._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0xc + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar58;
  auVar219._12_2_ = uVar100;
  auVar219._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar58;
  auVar218._10_2_ = uVar100;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar100;
  auVar217._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar33._4_8_ = auVar217._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar238 = (float)((int)sVar104 >> 8);
  fVar249 = (float)(auVar33._0_4_ >> 0x18);
  fVar251 = (float)(auVar217._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0xd + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar58;
  auVar222._12_2_ = uVar100;
  auVar222._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar58;
  auVar221._10_2_ = uVar100;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar100;
  auVar220._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar34._4_8_ = auVar220._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar291 = (float)((int)sVar104 >> 8);
  fVar297 = (float)(auVar34._0_4_ >> 0x18);
  fVar299 = (float)(auVar220._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0x12 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar58;
  auVar225._12_2_ = uVar100;
  auVar225._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar58;
  auVar224._10_2_ = uVar100;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar100;
  auVar223._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar35._4_8_ = auVar223._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  fVar274 = (float)((int)sVar104 >> 8);
  fVar280 = (float)(auVar35._0_4_ >> 0x18);
  fVar284 = (float)(auVar223._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0x13 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar228._8_4_ = 0;
  auVar228._0_8_ = uVar58;
  auVar228._12_2_ = uVar100;
  auVar228._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar227._12_4_ = auVar228._12_4_;
  auVar227._8_2_ = 0;
  auVar227._0_8_ = uVar58;
  auVar227._10_2_ = uVar100;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226._8_2_ = uVar100;
  auVar226._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar36._4_8_ = auVar226._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar302 = (float)((int)sVar104 >> 8);
  fVar307 = (float)(auVar36._0_4_ >> 0x18);
  fVar310 = (float)(auVar226._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar57 * 0x14 + 6);
  uVar139 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar139,uVar139);
  uVar139 = (undefined1)((uint)uVar48 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar100,uVar139),CONCAT14(uVar139,uVar48));
  uVar139 = (undefined1)((uint)uVar48 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar139),uVar139);
  sVar104 = CONCAT11((char)uVar48,(char)uVar48);
  uVar58 = CONCAT62(uVar28,sVar104);
  auVar321._8_4_ = 0;
  auVar321._0_8_ = uVar58;
  auVar321._12_2_ = uVar100;
  auVar321._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar320._12_4_ = auVar321._12_4_;
  auVar320._8_2_ = 0;
  auVar320._0_8_ = uVar58;
  auVar320._10_2_ = uVar100;
  auVar319._10_6_ = auVar320._10_6_;
  auVar319._8_2_ = uVar100;
  auVar319._0_8_ = uVar58;
  uVar100 = (undefined2)uVar28;
  auVar37._4_8_ = auVar319._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  fVar105 = (float)((int)sVar104 >> 8);
  fVar140 = (float)(auVar37._0_4_ >> 0x18);
  fVar141 = (float)(auVar319._8_4_ >> 0x18);
  fVar333 = fVar155 * fVar142 + fVar172 * fVar201 + fVar174 * fVar254;
  fVar338 = fVar155 * fVar150 + fVar172 * fVar210 + fVar174 * fVar267;
  fVar341 = fVar155 * fVar152 + fVar172 * fVar212 + fVar174 * fVar270;
  fVar344 = fVar155 * (float)(auVar107._12_4_ >> 0x18) +
            fVar172 * (float)(auVar110._12_4_ >> 0x18) + fVar174 * (float)(auVar113._12_4_ >> 0x18);
  fVar316 = fVar155 * fVar67 + fVar172 * fVar238 + fVar174 * fVar291;
  fVar324 = fVar155 * fVar101 + fVar172 * fVar249 + fVar174 * fVar297;
  fVar327 = fVar155 * fVar102 + fVar172 * fVar251 + fVar174 * fVar299;
  fVar330 = fVar155 * (float)(auVar116._12_4_ >> 0x18) +
            fVar172 * (float)(auVar218._12_4_ >> 0x18) + fVar174 * (float)(auVar221._12_4_ >> 0x18);
  fVar215 = fVar155 * fVar274 + fVar172 * fVar302 + fVar174 * fVar105;
  fVar233 = fVar155 * fVar280 + fVar172 * fVar307 + fVar174 * fVar140;
  fVar235 = fVar155 * fVar284 + fVar172 * fVar310 + fVar174 * fVar141;
  fVar155 = fVar155 * (float)(auVar224._12_4_ >> 0x18) +
            fVar172 * (float)(auVar227._12_4_ >> 0x18) + fVar174 * (float)(auVar320._12_4_ >> 0x18);
  fVar201 = fVar142 * fVar177 + fVar201 * fVar196 + fVar254 * fVar198;
  fVar210 = fVar150 * fVar177 + fVar210 * fVar196 + fVar267 * fVar198;
  fVar212 = fVar152 * fVar177 + fVar212 * fVar196 + fVar270 * fVar198;
  fVar254 = (float)(auVar107._12_4_ >> 0x18) * fVar177 +
            (float)(auVar110._12_4_ >> 0x18) * fVar196 + (float)(auVar113._12_4_ >> 0x18) * fVar198;
  fVar267 = fVar67 * fVar177 + fVar238 * fVar196 + fVar291 * fVar198;
  fVar270 = fVar101 * fVar177 + fVar249 * fVar196 + fVar297 * fVar198;
  fVar291 = fVar102 * fVar177 + fVar251 * fVar196 + fVar299 * fVar198;
  fVar297 = (float)(auVar116._12_4_ >> 0x18) * fVar177 +
            (float)(auVar218._12_4_ >> 0x18) * fVar196 + (float)(auVar221._12_4_ >> 0x18) * fVar198;
  fVar238 = fVar177 * fVar274 + fVar196 * fVar302 + fVar198 * fVar105;
  fVar249 = fVar177 * fVar280 + fVar196 * fVar307 + fVar198 * fVar140;
  fVar251 = fVar177 * fVar284 + fVar196 * fVar310 + fVar198 * fVar141;
  fVar177 = fVar177 * (float)(auVar224._12_4_ >> 0x18) +
            fVar196 * (float)(auVar227._12_4_ >> 0x18) + fVar198 * (float)(auVar320._12_4_ >> 0x18);
  fVar174 = (float)DAT_01f4bd50;
  fVar67 = DAT_01f4bd50._4_4_;
  fVar101 = DAT_01f4bd50._8_4_;
  fVar102 = DAT_01f4bd50._12_4_;
  uVar61 = -(uint)(fVar174 <= ABS(fVar333));
  uVar62 = -(uint)(fVar67 <= ABS(fVar338));
  uVar63 = -(uint)(fVar101 <= ABS(fVar341));
  uVar65 = -(uint)(fVar102 <= ABS(fVar344));
  auVar336._0_4_ = (uint)fVar333 & uVar61;
  auVar336._4_4_ = (uint)fVar338 & uVar62;
  auVar336._8_4_ = (uint)fVar341 & uVar63;
  auVar336._12_4_ = (uint)fVar344 & uVar65;
  auVar180._0_4_ = ~uVar61 & (uint)fVar174;
  auVar180._4_4_ = ~uVar62 & (uint)fVar67;
  auVar180._8_4_ = ~uVar63 & (uint)fVar101;
  auVar180._12_4_ = ~uVar65 & (uint)fVar102;
  auVar180 = auVar180 | auVar336;
  uVar61 = -(uint)(fVar174 <= ABS(fVar316));
  uVar62 = -(uint)(fVar67 <= ABS(fVar324));
  uVar63 = -(uint)(fVar101 <= ABS(fVar327));
  uVar65 = -(uint)(fVar102 <= ABS(fVar330));
  auVar322._0_4_ = (uint)fVar316 & uVar61;
  auVar322._4_4_ = (uint)fVar324 & uVar62;
  auVar322._8_4_ = (uint)fVar327 & uVar63;
  auVar322._12_4_ = (uint)fVar330 & uVar65;
  auVar203._0_4_ = ~uVar61 & (uint)fVar174;
  auVar203._4_4_ = ~uVar62 & (uint)fVar67;
  auVar203._8_4_ = ~uVar63 & (uint)fVar101;
  auVar203._12_4_ = ~uVar65 & (uint)fVar102;
  auVar203 = auVar203 | auVar322;
  uVar61 = -(uint)(fVar174 <= ABS(fVar215));
  uVar62 = -(uint)(fVar67 <= ABS(fVar233));
  uVar63 = -(uint)(fVar101 <= ABS(fVar235));
  uVar65 = -(uint)(fVar102 <= ABS(fVar155));
  auVar229._0_4_ = (uint)fVar215 & uVar61;
  auVar229._4_4_ = (uint)fVar233 & uVar62;
  auVar229._8_4_ = (uint)fVar235 & uVar63;
  auVar229._12_4_ = (uint)fVar155 & uVar65;
  auVar276._0_4_ = ~uVar61 & (uint)fVar174;
  auVar276._4_4_ = ~uVar62 & (uint)fVar67;
  auVar276._8_4_ = ~uVar63 & (uint)fVar101;
  auVar276._12_4_ = ~uVar65 & (uint)fVar102;
  auVar276 = auVar276 | auVar229;
  auVar68 = rcpps(_DAT_01f4bd50,auVar180);
  fVar174 = auVar68._0_4_;
  fVar102 = auVar68._4_4_;
  fVar141 = auVar68._8_4_;
  fVar152 = auVar68._12_4_;
  fVar174 = (1.0 - auVar180._0_4_ * fVar174) * fVar174 + fVar174;
  fVar102 = (1.0 - auVar180._4_4_ * fVar102) * fVar102 + fVar102;
  fVar141 = (1.0 - auVar180._8_4_ * fVar141) * fVar141 + fVar141;
  fVar152 = (1.0 - auVar180._12_4_ * fVar152) * fVar152 + fVar152;
  auVar68 = rcpps(auVar68,auVar203);
  fVar67 = auVar68._0_4_;
  fVar105 = auVar68._4_4_;
  fVar142 = auVar68._8_4_;
  fVar155 = auVar68._12_4_;
  fVar67 = (1.0 - auVar203._0_4_ * fVar67) * fVar67 + fVar67;
  fVar105 = (1.0 - auVar203._4_4_ * fVar105) * fVar105 + fVar105;
  fVar142 = (1.0 - auVar203._8_4_ * fVar142) * fVar142 + fVar142;
  fVar155 = (1.0 - auVar203._12_4_ * fVar155) * fVar155 + fVar155;
  auVar68 = rcpps(auVar68,auVar276);
  fVar101 = auVar68._0_4_;
  fVar140 = auVar68._4_4_;
  fVar150 = auVar68._8_4_;
  fVar172 = auVar68._12_4_;
  fVar101 = (1.0 - auVar276._0_4_ * fVar101) * fVar101 + fVar101;
  fVar140 = (1.0 - auVar276._4_4_ * fVar140) * fVar140 + fVar140;
  fVar150 = (1.0 - auVar276._8_4_ * fVar150) * fVar150 + fVar150;
  fVar172 = (1.0 - auVar276._12_4_ * fVar172) * fVar172 + fVar172;
  uVar58 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar58;
  auVar260._12_2_ = uVar100;
  auVar260._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar158._12_4_ = auVar260._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar58;
  auVar158._10_2_ = uVar100;
  auVar68._10_6_ = auVar158._10_6_;
  auVar68._8_2_ = uVar100;
  auVar68._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar38._4_8_ = auVar68._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  auVar181._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar210) * fVar102,
                ((float)(int)(short)uVar58 - fVar201) * fVar174);
  auVar181._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar212) * fVar141;
  auVar181._12_4_ = ((float)(auVar158._12_4_ >> 0x10) - fVar254) * fVar152;
  uVar58 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar58;
  auVar69._12_2_ = uVar100;
  auVar69._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar243._12_4_ = auVar69._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar58;
  auVar243._10_2_ = uVar100;
  auVar294._10_6_ = auVar243._10_6_;
  auVar294._8_2_ = uVar100;
  auVar294._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar39._4_8_ = auVar294._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  auVar204._0_4_ = ((float)(int)(short)uVar58 - fVar201) * fVar174;
  auVar204._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar210) * fVar102;
  auVar204._8_4_ = ((float)(auVar294._8_4_ >> 0x10) - fVar212) * fVar141;
  auVar204._12_4_ = ((float)(auVar243._12_4_ >> 0x10) - fVar254) * fVar152;
  uVar58 = *(ulong *)(prim + uVar57 * 0xe + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar58;
  auVar72._12_2_ = uVar100;
  auVar72._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar58;
  auVar71._10_2_ = uVar100;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar100;
  auVar70._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar40._4_8_ = auVar70._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  auVar143._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar270) * fVar105,
                ((float)(int)(short)uVar58 - fVar267) * fVar67);
  auVar143._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar291) * fVar142;
  auVar143._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar297) * fVar155;
  uVar58 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar58;
  auVar75._12_2_ = uVar100;
  auVar75._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar58;
  auVar74._10_2_ = uVar100;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar100;
  auVar73._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar41._4_8_ = auVar73._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  auVar257._0_4_ = ((float)(int)(short)uVar58 - fVar267) * fVar67;
  auVar257._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar270) * fVar105;
  auVar257._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar291) * fVar142;
  auVar257._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar297) * fVar155;
  uVar58 = *(ulong *)(prim + uVar57 * 0x15 + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar58;
  auVar78._12_2_ = uVar100;
  auVar78._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar58;
  auVar77._10_2_ = uVar100;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar100;
  auVar76._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar42._4_8_ = auVar76._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  auVar118._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar249) * fVar140,
                ((float)(int)(short)uVar58 - fVar238) * fVar101);
  auVar118._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar251) * fVar150;
  auVar118._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar177) * fVar172;
  uVar58 = *(ulong *)(prim + uVar57 * 0x17 + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar58;
  auVar81._12_2_ = uVar100;
  auVar81._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar58;
  auVar80._10_2_ = uVar100;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar100;
  auVar79._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar43._4_8_ = auVar79._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  auVar240._0_4_ = ((float)(int)(short)uVar58 - fVar238) * fVar101;
  auVar240._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar249) * fVar140;
  auVar240._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar251) * fVar150;
  auVar240._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar177) * fVar172;
  auVar157._8_4_ = auVar181._8_4_;
  auVar157._0_8_ = auVar181._0_8_;
  auVar157._12_4_ = auVar181._12_4_;
  auVar158 = minps(auVar157,auVar204);
  auVar82._8_4_ = auVar143._8_4_;
  auVar82._0_8_ = auVar143._0_8_;
  auVar82._12_4_ = auVar143._12_4_;
  auVar68 = minps(auVar82,auVar257);
  auVar158 = maxps(auVar158,auVar68);
  auVar83._8_4_ = auVar118._8_4_;
  auVar83._0_8_ = auVar118._0_8_;
  auVar83._12_4_ = auVar118._12_4_;
  auVar68 = minps(auVar83,auVar240);
  auVar230._4_4_ = uVar49;
  auVar230._0_4_ = uVar49;
  auVar230._8_4_ = uVar49;
  auVar230._12_4_ = uVar49;
  auVar68 = maxps(auVar68,auVar230);
  auVar68 = maxps(auVar158,auVar68);
  fVar174 = auVar68._0_4_ * 0.99999964;
  fVar67 = auVar68._4_4_ * 0.99999964;
  fVar101 = auVar68._8_4_ * 0.99999964;
  fVar102 = auVar68._12_4_ * 0.99999964;
  auVar158 = maxps(auVar181,auVar204);
  auVar68 = maxps(auVar143,auVar257);
  auVar158 = minps(auVar158,auVar68);
  auVar68 = maxps(auVar118,auVar240);
  uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar49;
  auVar144._0_4_ = uVar49;
  auVar144._8_4_ = uVar49;
  auVar144._12_4_ = uVar49;
  auVar68 = minps(auVar68,auVar144);
  auVar68 = minps(auVar158,auVar68);
  auVar119._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && fVar174 <= auVar68._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < (byte)PVar8 && fVar67 <= auVar68._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < (byte)PVar8 && fVar101 <= auVar68._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < (byte)PVar8 && fVar102 <= auVar68._12_4_ * 1.0000004);
  uVar61 = movmskps((uint)(byte)PVar8,auVar119);
  auVar120._0_12_ = mm_lookupmask_ps._240_12_;
  auVar120._12_4_ = 0;
LAB_003192d2:
  uVar58 = (ulong)uVar61;
  if (uVar58 == 0) {
    return;
  }
  lVar56 = 0;
  if (uVar58 != 0) {
    for (; (uVar61 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
    }
  }
  uVar58 = uVar58 - 1 & uVar58;
  uVar61 = *(uint *)(prim + 2);
  uVar62 = *(uint *)(prim + lVar56 * 4 + 6);
  local_5e0 = (ulong)uVar62;
  pGVar9 = (context->scene->geometries).items[uVar61].ptr;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 + _Var10 * local_5e0);
  p_Var55 = pGVar9[1].intersectionFilterN;
  lVar56 = 0;
  if (uVar58 != 0) {
    for (; (uVar58 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
    }
  }
  lVar56 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar56 + (long)p_Var55 * uVar57);
  pfVar2 = (float *)(lVar56 + (uVar57 + 1) * (long)p_Var55);
  pfVar3 = (float *)(lVar56 + (uVar57 + 2) * (long)p_Var55);
  pfVar4 = (float *)(lVar56 + (uVar57 + 3) * (long)p_Var55);
  if ((uVar58 != 0) && (uVar57 = uVar58 - 1 & uVar58, uVar57 != 0)) {
    lVar56 = 0;
    if (uVar57 != 0) {
      for (; (uVar57 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
      }
    }
    p_Var55 = (RTCFilterFunctionN)
              ((long)p_Var55 *
              (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                              _Var10 * *(uint *)(prim + lVar56 * 4 + 6)));
  }
  fVar105 = *(float *)(ray + k * 4 + 0x40);
  fVar140 = *(float *)(ray + k * 4 + 0x50);
  fVar150 = *(float *)(ray + k * 4 + 0x60);
  fVar141 = fVar140 * fVar140;
  fVar142 = fVar150 * fVar150;
  fVar238 = fVar141 + fVar105 * fVar105 + fVar142;
  auVar121._0_8_ = CONCAT44(fVar141 + fVar141 + 0.0,fVar238);
  auVar121._8_4_ = fVar141 + fVar142 + fVar142;
  auVar121._12_4_ = fVar141 + 0.0 + 0.0;
  auVar205._8_4_ = auVar121._8_4_;
  auVar205._0_8_ = auVar121._0_8_;
  auVar205._12_4_ = auVar121._12_4_;
  auVar68 = rcpss(auVar205,auVar121);
  fVar196 = (2.0 - auVar68._0_4_ * fVar238) * auVar68._0_4_ *
            (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 -
             *(float *)(ray + k * 4 + 0x20)) * fVar150 +
            ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - *(float *)(ray + k * 4 + 0x10)
            ) * fVar140 +
            ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - *(float *)(ray + k * 4)) * fVar105);
  fVar249 = fVar105 * fVar196 + *(float *)(ray + k * 4);
  fVar251 = fVar140 * fVar196 + *(float *)(ray + k * 4 + 0x10);
  fVar177 = fVar150 * fVar196 + *(float *)(ray + k * 4 + 0x20);
  fVar198 = *pfVar1 - fVar249;
  fVar215 = pfVar1[1] - fVar251;
  fVar233 = pfVar1[2] - fVar177;
  fVar235 = pfVar1[3] - 0.0;
  fVar284 = *pfVar3 - fVar249;
  fVar291 = pfVar3[1] - fVar251;
  fVar297 = pfVar3[2] - fVar177;
  fVar299 = pfVar3[3] - 0.0;
  fVar307 = *pfVar2 - fVar249;
  fVar310 = pfVar2[1] - fVar251;
  fVar316 = pfVar2[2] - fVar177;
  fVar324 = pfVar2[3] - 0.0;
  fVar249 = *pfVar4 - fVar249;
  fVar251 = pfVar4[1] - fVar251;
  fVar177 = pfVar4[2] - fVar177;
  fVar302 = pfVar4[3] - 0.0;
  fVar141 = fVar140 * fVar140;
  fVar267 = fVar105 * fVar105;
  fVar270 = fVar267 + fVar141 + fVar142;
  fVar274 = fVar267 + fVar141 + fVar142;
  fVar280 = fVar267 + fVar141 + fVar142;
  fVar267 = fVar267 + fVar141 + fVar142;
  fVar141 = *(float *)(ray + k * 4 + 0x40);
  fVar172 = ABS(fVar270);
  fVar210 = ABS(fVar274);
  fVar212 = ABS(fVar280);
  fVar254 = ABS(fVar267);
  fVar142 = *(float *)(ray + k * 4 + 0x30);
  fVar201 = fVar142 - fVar196;
  pSVar50 = (StackEntry *)0x1;
  local_6ac = 1;
  fVar152 = 0.0;
  fVar155 = 1.0;
  p_Var54 = (RTCFilterFunctionN)0x0;
  auVar68 = _DAT_01f46a60;
  do {
    fVar178 = fVar155 - fVar152;
    fVar330 = fVar178 * 0.0 + fVar152;
    fVar333 = fVar178 * 0.33333334 + fVar152;
    fVar338 = fVar178 * 0.6666667 + fVar152;
    fVar341 = fVar178 * 1.0 + fVar152;
    fVar292 = auVar68._0_4_ - fVar330;
    fVar298 = auVar68._4_4_ - fVar333;
    fVar300 = auVar68._8_4_ - fVar338;
    fVar301 = auVar68._12_4_ - fVar341;
    fVar344 = fVar307 * fVar292 + fVar284 * fVar330;
    fVar281 = fVar307 * fVar298 + fVar284 * fVar333;
    fVar285 = fVar307 * fVar300 + fVar284 * fVar338;
    fVar288 = fVar307 * fVar301 + fVar284 * fVar341;
    fVar303 = fVar310 * fVar292 + fVar291 * fVar330;
    fVar308 = fVar310 * fVar298 + fVar291 * fVar333;
    fVar311 = fVar310 * fVar300 + fVar291 * fVar338;
    fVar313 = fVar310 * fVar301 + fVar291 * fVar341;
    fVar327 = fVar316 * fVar292 + fVar297 * fVar330;
    fVar151 = fVar316 * fVar298 + fVar297 * fVar333;
    fVar153 = fVar316 * fVar300 + fVar297 * fVar338;
    fVar154 = fVar316 * fVar301 + fVar297 * fVar341;
    fVar239 = fVar324 * fVar292 + fVar299 * fVar330;
    fVar250 = fVar324 * fVar298 + fVar299 * fVar333;
    fVar252 = fVar324 * fVar300 + fVar299 * fVar338;
    fVar253 = fVar324 * fVar301 + fVar299 * fVar341;
    fVar156 = (fVar198 * fVar292 + fVar307 * fVar330) * fVar292 + fVar330 * fVar344;
    fVar173 = (fVar198 * fVar298 + fVar307 * fVar333) * fVar298 + fVar333 * fVar281;
    fVar175 = (fVar198 * fVar300 + fVar307 * fVar338) * fVar300 + fVar338 * fVar285;
    fVar176 = (fVar198 * fVar301 + fVar307 * fVar341) * fVar301 + fVar341 * fVar288;
    fVar179 = (fVar215 * fVar292 + fVar310 * fVar330) * fVar292 + fVar330 * fVar303;
    fVar197 = (fVar215 * fVar298 + fVar310 * fVar333) * fVar298 + fVar333 * fVar308;
    fVar199 = (fVar215 * fVar300 + fVar310 * fVar338) * fVar300 + fVar338 * fVar311;
    fVar200 = (fVar215 * fVar301 + fVar310 * fVar341) * fVar301 + fVar341 * fVar313;
    fVar202 = (fVar233 * fVar292 + fVar316 * fVar330) * fVar292 + fVar330 * fVar327;
    fVar211 = (fVar233 * fVar298 + fVar316 * fVar333) * fVar298 + fVar333 * fVar151;
    fVar213 = (fVar233 * fVar300 + fVar316 * fVar338) * fVar300 + fVar338 * fVar153;
    fVar214 = (fVar233 * fVar301 + fVar316 * fVar341) * fVar301 + fVar341 * fVar154;
    fVar216 = (fVar235 * fVar292 + fVar324 * fVar330) * fVar292 + fVar330 * fVar239;
    fVar234 = (fVar235 * fVar298 + fVar324 * fVar333) * fVar298 + fVar333 * fVar250;
    fVar236 = (fVar235 * fVar300 + fVar324 * fVar338) * fVar300 + fVar338 * fVar252;
    fVar237 = (fVar235 * fVar301 + fVar324 * fVar341) * fVar301 + fVar341 * fVar253;
    fVar275 = fVar344 * fVar292 + (fVar284 * fVar292 + fVar249 * fVar330) * fVar330;
    fVar281 = fVar281 * fVar298 + (fVar284 * fVar298 + fVar249 * fVar333) * fVar333;
    fVar285 = fVar285 * fVar300 + (fVar284 * fVar300 + fVar249 * fVar338) * fVar338;
    fVar288 = fVar288 * fVar301 + (fVar284 * fVar301 + fVar249 * fVar341) * fVar341;
    fVar303 = fVar303 * fVar292 + (fVar291 * fVar292 + fVar251 * fVar330) * fVar330;
    fVar308 = fVar308 * fVar298 + (fVar291 * fVar298 + fVar251 * fVar333) * fVar333;
    fVar311 = fVar311 * fVar300 + (fVar291 * fVar300 + fVar251 * fVar338) * fVar338;
    fVar314 = fVar313 * fVar301 + (fVar291 * fVar301 + fVar251 * fVar341) * fVar341;
    fVar344 = fVar327 * fVar292 + (fVar297 * fVar292 + fVar177 * fVar330) * fVar330;
    fVar151 = fVar151 * fVar298 + (fVar297 * fVar298 + fVar177 * fVar333) * fVar333;
    fVar153 = fVar153 * fVar300 + (fVar297 * fVar300 + fVar177 * fVar338) * fVar338;
    fVar154 = fVar154 * fVar301 + (fVar297 * fVar301 + fVar177 * fVar341) * fVar341;
    fVar239 = fVar239 * fVar292 + (fVar299 * fVar292 + fVar302 * fVar330) * fVar330;
    fVar250 = fVar250 * fVar298 + (fVar299 * fVar298 + fVar302 * fVar333) * fVar333;
    fVar252 = fVar252 * fVar300 + (fVar299 * fVar300 + fVar302 * fVar338) * fVar338;
    fVar253 = fVar253 * fVar301 + (fVar299 * fVar301 + fVar302 * fVar341) * fVar341;
    fVar334 = fVar292 * fVar156 + fVar330 * fVar275;
    fVar339 = fVar298 * fVar173 + fVar333 * fVar281;
    fVar342 = fVar300 * fVar175 + fVar338 * fVar285;
    fVar345 = fVar301 * fVar176 + fVar341 * fVar288;
    fVar347 = fVar292 * fVar179 + fVar330 * fVar303;
    fVar351 = fVar298 * fVar197 + fVar333 * fVar308;
    fVar352 = fVar300 * fVar199 + fVar338 * fVar311;
    fVar353 = fVar301 * fVar200 + fVar341 * fVar314;
    fVar317 = fVar292 * fVar202 + fVar330 * fVar344;
    fVar325 = fVar298 * fVar211 + fVar333 * fVar151;
    fVar328 = fVar300 * fVar213 + fVar338 * fVar153;
    fVar331 = fVar301 * fVar214 + fVar341 * fVar154;
    fVar327 = fVar178 * 0.11111111;
    fVar292 = fVar292 * fVar216 + fVar330 * fVar239;
    fVar298 = fVar298 * fVar234 + fVar333 * fVar250;
    auVar293._0_8_ = CONCAT44(fVar298,fVar292);
    auVar293._8_4_ = fVar300 * fVar236 + fVar338 * fVar252;
    auVar293._12_4_ = fVar301 * fVar237 + fVar341 * fVar253;
    fVar313 = (fVar275 - fVar156) * 3.0 * fVar327;
    fVar282 = (fVar281 - fVar173) * 3.0 * fVar327;
    fVar286 = (fVar285 - fVar175) * 3.0 * fVar327;
    fVar289 = (fVar288 - fVar176) * 3.0 * fVar327;
    fVar304 = (fVar303 - fVar179) * 3.0 * fVar327;
    fVar309 = (fVar308 - fVar197) * 3.0 * fVar327;
    fVar312 = (fVar311 - fVar199) * 3.0 * fVar327;
    fVar315 = (fVar314 - fVar200) * 3.0 * fVar327;
    fVar176 = (fVar344 - fVar202) * 3.0 * fVar327;
    fVar197 = (fVar151 - fVar211) * 3.0 * fVar327;
    fVar200 = (fVar153 - fVar213) * 3.0 * fVar327;
    fVar211 = (fVar154 - fVar214) * 3.0 * fVar327;
    fVar330 = fVar327 * (fVar250 - fVar234) * 3.0;
    fVar333 = fVar327 * (fVar252 - fVar236) * 3.0;
    fVar338 = fVar327 * (fVar253 - fVar237) * 3.0;
    auVar182._4_4_ = auVar293._8_4_;
    auVar182._0_4_ = fVar298;
    auVar182._8_4_ = auVar293._12_4_;
    auVar182._12_4_ = 0;
    local_668._4_4_ = fVar298 + fVar330;
    local_668._0_4_ = fVar292 + fVar327 * (fVar239 - fVar216) * 3.0;
    fStack_660 = auVar293._8_4_ + fVar333;
    fStack_65c = auVar293._12_4_ + fVar338;
    auVar183._0_8_ = CONCAT44(auVar293._8_4_ - fVar333,fVar298 - fVar330);
    auVar183._8_4_ = auVar293._12_4_ - fVar338;
    auVar183._12_4_ = 0;
    fVar253 = fVar351 - fVar347;
    fVar281 = fVar352 - fVar351;
    fVar288 = fVar353 - fVar352;
    fVar298 = 0.0 - fVar353;
    fVar354 = fVar325 - fVar317;
    fVar361 = fVar328 - fVar325;
    fVar362 = fVar331 - fVar328;
    fVar363 = 0.0 - fVar331;
    fVar327 = fVar304 * fVar354 - fVar176 * fVar253;
    fVar330 = fVar309 * fVar361 - fVar197 * fVar281;
    fVar333 = fVar312 * fVar362 - fVar200 * fVar288;
    fVar338 = fVar315 * fVar363 - fVar211 * fVar298;
    fVar214 = fVar339 - fVar334;
    fVar234 = fVar342 - fVar339;
    fVar237 = fVar345 - fVar342;
    fVar250 = 0.0 - fVar345;
    fVar154 = fVar176 * fVar214 - fVar313 * fVar354;
    fVar156 = fVar197 * fVar234 - fVar282 * fVar361;
    fVar173 = fVar200 * fVar237 - fVar286 * fVar362;
    fVar175 = fVar211 * fVar250 - fVar289 * fVar363;
    fVar179 = fVar313 * fVar253 - fVar304 * fVar214;
    fVar199 = fVar282 * fVar281 - fVar309 * fVar234;
    fVar202 = fVar286 * fVar288 - fVar312 * fVar237;
    fVar213 = fVar289 * fVar298 - fVar315 * fVar250;
    auVar159._0_4_ = fVar354 * fVar354;
    auVar159._4_4_ = fVar361 * fVar361;
    auVar159._8_4_ = fVar362 * fVar362;
    auVar159._12_4_ = fVar363 * fVar363;
    auVar231._0_4_ = fVar214 * fVar214 + fVar253 * fVar253 + auVar159._0_4_;
    auVar231._4_4_ = fVar234 * fVar234 + fVar281 * fVar281 + auVar159._4_4_;
    auVar231._8_4_ = fVar237 * fVar237 + fVar288 * fVar288 + auVar159._8_4_;
    auVar231._12_4_ = fVar250 * fVar250 + fVar298 * fVar298 + auVar159._12_4_;
    auVar68 = rcpps(auVar159,auVar231);
    fVar341 = auVar68._0_4_;
    fVar344 = auVar68._4_4_;
    fVar151 = auVar68._8_4_;
    fVar153 = auVar68._12_4_;
    fVar341 = (1.0 - fVar341 * auVar231._0_4_) * fVar341 + fVar341;
    fVar344 = (1.0 - fVar344 * auVar231._4_4_) * fVar344 + fVar344;
    fVar151 = (1.0 - fVar151 * auVar231._8_4_) * fVar151 + fVar151;
    fVar153 = (1.0 - fVar153 * auVar231._12_4_) * fVar153 + fVar153;
    fVar216 = fVar354 * fVar309 - fVar253 * fVar197;
    fVar236 = fVar361 * fVar312 - fVar281 * fVar200;
    fVar239 = fVar362 * fVar315 - fVar288 * fVar211;
    fVar252 = fVar363 * 0.0 - fVar298 * 0.0;
    fVar275 = fVar214 * fVar197 - fVar354 * fVar282;
    fVar285 = fVar234 * fVar200 - fVar361 * fVar286;
    fVar292 = fVar237 * fVar211 - fVar362 * fVar289;
    fVar300 = fVar250 * 0.0 - fVar363 * 0.0;
    fVar301 = fVar253 * fVar282 - fVar214 * fVar309;
    fVar303 = fVar281 * fVar286 - fVar234 * fVar312;
    fVar308 = fVar288 * fVar289 - fVar237 * fVar315;
    fVar311 = fVar298 * 0.0 - fVar250 * 0.0;
    auVar348._0_4_ = fVar301 * fVar301;
    auVar348._4_4_ = fVar303 * fVar303;
    auVar348._8_4_ = fVar308 * fVar308;
    auVar348._12_4_ = fVar311 * fVar311;
    auVar84._0_4_ = (fVar327 * fVar327 + fVar154 * fVar154 + fVar179 * fVar179) * fVar341;
    auVar84._4_4_ = (fVar330 * fVar330 + fVar156 * fVar156 + fVar199 * fVar199) * fVar344;
    auVar84._8_4_ = (fVar333 * fVar333 + fVar173 * fVar173 + fVar202 * fVar202) * fVar151;
    auVar84._12_4_ = (fVar338 * fVar338 + fVar175 * fVar175 + fVar213 * fVar213) * fVar153;
    auVar258._0_4_ = (fVar216 * fVar216 + fVar275 * fVar275 + auVar348._0_4_) * fVar341;
    auVar258._4_4_ = (fVar236 * fVar236 + fVar285 * fVar285 + auVar348._4_4_) * fVar344;
    auVar258._8_4_ = (fVar239 * fVar239 + fVar292 * fVar292 + auVar348._8_4_) * fVar151;
    auVar258._12_4_ = (fVar252 * fVar252 + fVar300 * fVar300 + auVar348._12_4_) * fVar153;
    auVar68 = maxps(auVar84,auVar258);
    auVar241._8_4_ = auVar293._8_4_;
    auVar241._0_8_ = auVar293._0_8_;
    auVar241._12_4_ = auVar293._12_4_;
    auVar158 = maxps(auVar241,_local_668);
    auVar259._8_4_ = auVar183._8_4_;
    auVar259._0_8_ = auVar183._0_8_;
    auVar259._12_4_ = 0;
    auVar260 = maxps(auVar259,auVar182);
    auVar260 = maxps(auVar158,auVar260);
    auVar294 = minps(auVar293,_local_668);
    auVar158 = minps(auVar183,auVar182);
    auVar158 = minps(auVar294,auVar158);
    auVar68 = sqrtps(auVar68,auVar68);
    auVar294 = rsqrtps(auVar348,auVar231);
    fVar327 = auVar294._0_4_;
    fVar330 = auVar294._4_4_;
    fVar338 = auVar294._8_4_;
    fVar341 = auVar294._12_4_;
    fVar333 = fVar327 * fVar327 * auVar231._0_4_ * -0.5 * fVar327 + fVar327 * 1.5;
    fVar344 = fVar330 * fVar330 * auVar231._4_4_ * -0.5 * fVar330 + fVar330 * 1.5;
    fVar154 = fVar338 * fVar338 * auVar231._8_4_ * -0.5 * fVar338 + fVar338 * 1.5;
    fVar175 = fVar341 * fVar341 * auVar231._12_4_ * -0.5 * fVar341 + fVar341 * 1.5;
    fVar179 = 0.0 - fVar347;
    fVar199 = 0.0 - fVar351;
    fVar202 = 0.0 - fVar352;
    fVar213 = 0.0 - fVar353;
    fVar335 = 0.0 - fVar317;
    fVar340 = 0.0 - fVar325;
    fVar343 = 0.0 - fVar328;
    fVar346 = 0.0 - fVar331;
    fVar275 = 0.0 - fVar334;
    fVar285 = 0.0 - fVar339;
    fVar292 = 0.0 - fVar342;
    fVar300 = 0.0 - fVar345;
    fVar314 = fVar141 * fVar214 * fVar333 +
              fVar140 * fVar253 * fVar333 + fVar150 * fVar354 * fVar333;
    fVar283 = fVar141 * fVar234 * fVar344 +
              fVar140 * fVar281 * fVar344 + fVar150 * fVar361 * fVar344;
    fVar287 = fVar141 * fVar237 * fVar154 +
              fVar140 * fVar288 * fVar154 + fVar150 * fVar362 * fVar154;
    fVar290 = fVar141 * fVar250 * fVar175 +
              fVar140 * fVar298 * fVar175 + fVar150 * fVar363 * fVar175;
    fVar216 = fVar214 * fVar333 * fVar275 +
              fVar253 * fVar333 * fVar179 + fVar354 * fVar333 * fVar335;
    fVar236 = fVar234 * fVar344 * fVar285 +
              fVar281 * fVar344 * fVar199 + fVar361 * fVar344 * fVar340;
    fVar239 = fVar237 * fVar154 * fVar292 +
              fVar288 * fVar154 * fVar202 + fVar362 * fVar154 * fVar343;
    fVar252 = fVar250 * fVar175 * fVar300 +
              fVar298 * fVar175 * fVar213 + fVar363 * fVar175 * fVar346;
    fVar327 = (fVar141 * fVar275 + fVar140 * fVar179 + fVar150 * fVar335) - fVar314 * fVar216;
    fVar338 = (fVar141 * fVar285 + fVar140 * fVar199 + fVar150 * fVar340) - fVar283 * fVar236;
    fVar151 = (fVar141 * fVar292 + fVar140 * fVar202 + fVar150 * fVar343) - fVar287 * fVar239;
    fVar156 = (fVar141 * fVar300 + fVar140 * fVar213 + fVar150 * fVar346) - fVar290 * fVar252;
    fVar330 = (fVar275 * fVar275 + fVar179 * fVar179 + fVar335 * fVar335) - fVar216 * fVar216;
    fVar341 = (fVar285 * fVar285 + fVar199 * fVar199 + fVar340 * fVar340) - fVar236 * fVar236;
    fVar153 = (fVar292 * fVar292 + fVar202 * fVar202 + fVar343 * fVar343) - fVar239 * fVar239;
    fVar173 = (fVar300 * fVar300 + fVar213 * fVar213 + fVar346 * fVar346) - fVar252 * fVar252;
    fVar301 = (auVar260._0_4_ + auVar68._0_4_) * 1.0000002;
    fVar303 = (auVar260._4_4_ + auVar68._4_4_) * 1.0000002;
    fVar308 = (auVar260._8_4_ + auVar68._8_4_) * 1.0000002;
    fVar311 = (auVar260._12_4_ + auVar68._12_4_) * 1.0000002;
    auVar355._0_4_ = fVar330 - fVar301 * fVar301;
    auVar355._4_4_ = fVar341 - fVar303 * fVar303;
    auVar355._8_4_ = fVar153 - fVar308 * fVar308;
    auVar355._12_4_ = fVar173 - fVar311 * fVar311;
    auVar261._0_4_ = fVar270 - fVar314 * fVar314;
    auVar261._4_4_ = fVar274 - fVar283 * fVar283;
    auVar261._8_4_ = fVar280 - fVar287 * fVar287;
    auVar261._12_4_ = fVar267 - fVar290 * fVar290;
    fVar327 = fVar327 + fVar327;
    fVar338 = fVar338 + fVar338;
    fVar151 = fVar151 + fVar151;
    fVar156 = fVar156 + fVar156;
    auVar242._0_4_ = fVar327 * fVar327 - auVar261._0_4_ * 4.0 * auVar355._0_4_;
    auVar242._4_4_ = fVar338 * fVar338 - auVar261._4_4_ * 4.0 * auVar355._4_4_;
    auVar242._8_4_ = fVar151 * fVar151 - auVar261._8_4_ * 4.0 * auVar355._8_4_;
    auVar242._12_4_ = fVar156 * fVar156 - auVar261._12_4_ * 4.0 * auVar355._12_4_;
    local_658._4_4_ = (auVar158._4_4_ - auVar68._4_4_) * 0.99999976;
    local_658._0_4_ = (auVar158._0_4_ - auVar68._0_4_) * 0.99999976;
    fStack_650 = (auVar158._8_4_ - auVar68._8_4_) * 0.99999976;
    fStack_64c = (auVar158._12_4_ - auVar68._12_4_) * 0.99999976;
    auVar184._4_4_ = -(uint)(0.0 <= auVar242._4_4_);
    auVar184._0_4_ = -(uint)(0.0 <= auVar242._0_4_);
    auVar184._8_4_ = -(uint)(0.0 <= auVar242._8_4_);
    auVar184._12_4_ = -(uint)(0.0 <= auVar242._12_4_);
    iVar47 = movmskps((int)pSVar50,auVar184);
    auVar145._0_8_ = CONCAT44(fVar283 * fVar283,fVar314 * fVar314) & 0x7fffffff7fffffff;
    auVar145._8_4_ = ABS(fVar287 * fVar287);
    auVar145._12_4_ = ABS(fVar290 * fVar290);
    fVar301 = ABS(auVar261._0_4_);
    fVar303 = ABS(auVar261._4_4_);
    fVar308 = ABS(auVar261._8_4_);
    fVar311 = ABS(auVar261._12_4_);
    if (iVar47 == 0) {
      iVar47 = 0;
      auVar263 = _DAT_01f45a40;
      auVar349 = _DAT_01f45a30;
    }
    else {
      auVar158 = sqrtps(auVar355,auVar242);
      bVar60 = 0.0 <= auVar242._0_4_;
      uVar63 = -(uint)bVar60;
      bVar11 = 0.0 <= auVar242._4_4_;
      uVar65 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar242._8_4_;
      uVar64 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar242._12_4_;
      uVar66 = -(uint)bVar13;
      auVar122._0_4_ = auVar261._0_4_ + auVar261._0_4_;
      auVar122._4_4_ = auVar261._4_4_ + auVar261._4_4_;
      auVar122._8_4_ = auVar261._8_4_ + auVar261._8_4_;
      auVar122._12_4_ = auVar261._12_4_ + auVar261._12_4_;
      auVar68 = rcpps(auVar261,auVar122);
      fVar318 = auVar68._0_4_;
      fVar326 = auVar68._4_4_;
      fVar329 = auVar68._8_4_;
      fVar332 = auVar68._12_4_;
      fVar318 = (1.0 - auVar122._0_4_ * fVar318) * fVar318 + fVar318;
      fVar326 = (1.0 - auVar122._4_4_ * fVar326) * fVar326 + fVar326;
      fVar329 = (1.0 - auVar122._8_4_ * fVar329) * fVar329 + fVar329;
      fVar332 = (1.0 - auVar122._12_4_ * fVar332) * fVar332 + fVar332;
      fVar255 = (-fVar327 - auVar158._0_4_) * fVar318;
      fVar268 = (-fVar338 - auVar158._4_4_) * fVar326;
      fVar271 = (-fVar151 - auVar158._8_4_) * fVar329;
      fVar273 = (-fVar156 - auVar158._12_4_) * fVar332;
      fVar318 = (auVar158._0_4_ - fVar327) * fVar318;
      fVar326 = (auVar158._4_4_ - fVar338) * fVar326;
      fVar329 = (auVar158._8_4_ - fVar151) * fVar329;
      fVar332 = (auVar158._12_4_ - fVar156) * fVar332;
      local_218 = (fVar314 * fVar255 + fVar216) * fVar333;
      fStack_214 = (fVar283 * fVar268 + fVar236) * fVar344;
      fStack_210 = (fVar287 * fVar271 + fVar239) * fVar154;
      fStack_20c = (fVar290 * fVar273 + fVar252) * fVar175;
      local_208 = (fVar314 * fVar318 + fVar216) * fVar333;
      fStack_204 = (fVar283 * fVar326 + fVar236) * fVar344;
      fStack_200 = (fVar287 * fVar329 + fVar239) * fVar154;
      fStack_1fc = (fVar290 * fVar332 + fVar252) * fVar175;
      auVar262._0_4_ = (uint)fVar255 & uVar63;
      auVar262._4_4_ = (uint)fVar268 & uVar65;
      auVar262._8_4_ = (uint)fVar271 & uVar64;
      auVar262._12_4_ = (uint)fVar273 & uVar66;
      auVar349._0_8_ = CONCAT44(~uVar65,~uVar63) & 0x7f8000007f800000;
      auVar349._8_4_ = ~uVar64 & 0x7f800000;
      auVar349._12_4_ = ~uVar66 & 0x7f800000;
      auVar349 = auVar349 | auVar262;
      auVar356._0_4_ = (uint)fVar318 & uVar63;
      auVar356._4_4_ = (uint)fVar326 & uVar65;
      auVar356._8_4_ = (uint)fVar329 & uVar64;
      auVar356._12_4_ = (uint)fVar332 & uVar66;
      auVar263._0_8_ = CONCAT44(~uVar65,~uVar63) & 0xff800000ff800000;
      auVar263._8_4_ = ~uVar64 & 0xff800000;
      auVar263._12_4_ = ~uVar66 & 0xff800000;
      auVar263 = auVar263 | auVar356;
      auVar23._4_4_ = fVar210;
      auVar23._0_4_ = fVar172;
      auVar23._8_4_ = fVar212;
      auVar23._12_4_ = fVar254;
      auVar68 = maxps(auVar23,auVar145);
      fVar318 = auVar68._0_4_ * 1.9073486e-06;
      fVar255 = auVar68._4_4_ * 1.9073486e-06;
      fVar326 = auVar68._8_4_ * 1.9073486e-06;
      fVar268 = auVar68._12_4_ * 1.9073486e-06;
      auVar357._0_4_ = -(uint)(fVar301 < fVar318 && bVar60);
      auVar357._4_4_ = -(uint)(fVar303 < fVar255 && bVar11);
      auVar357._8_4_ = -(uint)(fVar308 < fVar326 && bVar12);
      auVar357._12_4_ = -(uint)(fVar311 < fVar268 && bVar13);
      iVar47 = movmskps(iVar47,auVar357);
      if (iVar47 != 0) {
        uVar63 = -(uint)(auVar355._0_4_ <= 0.0);
        uVar65 = -(uint)(auVar355._4_4_ <= 0.0);
        uVar64 = -(uint)(auVar355._8_4_ <= 0.0);
        uVar66 = -(uint)(auVar355._12_4_ <= 0.0);
        local_6a8 = CONCAT44(~uVar65,~uVar63) & 0x7f8000007f800000;
        auVar185._0_4_ = (uVar63 & 0xff800000 | (uint)local_6a8) & auVar357._0_4_;
        auVar185._4_4_ = (uVar65 & 0xff800000 | local_6a8._4_4_) & auVar357._4_4_;
        auVar185._8_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar357._8_4_;
        auVar185._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar357._12_4_;
        auVar337._0_4_ = ~auVar357._0_4_ & auVar349._0_4_;
        auVar337._4_4_ = ~auVar357._4_4_ & auVar349._4_4_;
        auVar337._8_4_ = ~auVar357._8_4_ & auVar349._8_4_;
        auVar337._12_4_ = ~auVar357._12_4_ & auVar349._12_4_;
        auVar350._0_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar357._0_4_;
        auVar350._4_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar357._4_4_;
        auVar350._8_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar357._8_4_;
        auVar350._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar357._12_4_;
        auVar358._0_4_ = ~auVar357._0_4_ & auVar263._0_4_;
        auVar358._4_4_ = ~auVar357._4_4_ & auVar263._4_4_;
        auVar358._8_4_ = ~auVar357._8_4_ & auVar263._8_4_;
        auVar358._12_4_ = ~auVar357._12_4_ & auVar263._12_4_;
        auVar184._4_4_ = -(uint)((fVar255 <= fVar303 || auVar355._4_4_ <= 0.0) && bVar11);
        auVar184._0_4_ = -(uint)((fVar318 <= fVar301 || auVar355._0_4_ <= 0.0) && bVar60);
        auVar184._8_4_ = -(uint)((fVar326 <= fVar308 || auVar355._8_4_ <= 0.0) && bVar12);
        auVar184._12_4_ = -(uint)((fVar268 <= fVar311 || auVar355._12_4_ <= 0.0) && bVar13);
        auVar263 = auVar358 | auVar350;
        auVar349 = auVar337 | auVar185;
      }
    }
    auVar186._0_4_ = (auVar184._0_4_ << 0x1f) >> 0x1f;
    auVar186._4_4_ = (auVar184._4_4_ << 0x1f) >> 0x1f;
    auVar186._8_4_ = (auVar184._8_4_ << 0x1f) >> 0x1f;
    auVar186._12_4_ = (auVar184._12_4_ << 0x1f) >> 0x1f;
    auVar186 = auVar186 & auVar120;
    iVar47 = movmskps(iVar47,auVar186);
    auVar68 = _DAT_01f46a60;
    if (iVar47 == 0) {
LAB_0031a34e:
      uVar57 = 0;
    }
    else {
      fVar318 = *(float *)(ray + k * 4 + 0x80);
      auVar305._0_4_ = fVar318 - fVar196;
      auVar305._4_4_ = auVar305._0_4_;
      auVar305._8_4_ = auVar305._0_4_;
      auVar305._12_4_ = auVar305._0_4_;
      auVar294 = minps(auVar305,auVar263);
      auVar27._4_4_ = fVar201;
      auVar27._0_4_ = fVar201;
      auVar27._8_4_ = fVar201;
      auVar27._12_4_ = fVar201;
      auVar260 = maxps(auVar27,auVar349);
      auVar85._0_4_ = fVar179 * fVar304 + fVar335 * fVar176;
      auVar85._4_4_ = fVar199 * fVar309 + fVar340 * fVar197;
      auVar85._8_4_ = fVar202 * fVar312 + fVar343 * fVar200;
      auVar85._12_4_ = fVar213 * fVar315 + fVar346 * fVar211;
      auVar277._0_4_ = fVar313 * fVar141 + fVar304 * fVar140 + fVar176 * fVar150;
      auVar277._4_4_ = fVar282 * fVar141 + fVar309 * fVar140 + fVar197 * fVar150;
      auVar277._8_4_ = fVar286 * fVar141 + fVar312 * fVar140 + fVar200 * fVar150;
      auVar277._12_4_ = fVar289 * fVar141 + fVar315 * fVar140 + fVar211 * fVar150;
      auVar158 = rcpps(auVar85,auVar277);
      fVar176 = auVar158._0_4_;
      fVar179 = auVar158._4_4_;
      fVar199 = auVar158._8_4_;
      fVar202 = auVar158._12_4_;
      uVar256 = (uint)DAT_01f46720;
      uVar269 = DAT_01f46720._4_4_;
      uVar272 = DAT_01f46720._8_4_;
      fVar213 = DAT_01f46720._12_4_;
      fVar176 = ((1.0 - auVar277._0_4_ * fVar176) * fVar176 + fVar176) *
                (float)((uint)(fVar275 * fVar313 + auVar85._0_4_) ^ uVar256);
      fVar179 = ((1.0 - auVar277._4_4_ * fVar179) * fVar179 + fVar179) *
                (float)((uint)(fVar285 * fVar282 + auVar85._4_4_) ^ uVar269);
      fVar199 = ((1.0 - auVar277._8_4_ * fVar199) * fVar199 + fVar199) *
                (float)((uint)(fVar292 * fVar286 + auVar85._8_4_) ^ uVar272);
      fVar202 = ((1.0 - auVar277._12_4_ * fVar202) * fVar202 + fVar202) *
                (float)((uint)(fVar300 * fVar289 + auVar85._12_4_) ^ (uint)fVar213);
      uVar63 = -(uint)(auVar277._0_4_ < 0.0 || ABS(auVar277._0_4_) < 1e-18);
      uVar65 = -(uint)(auVar277._4_4_ < 0.0 || ABS(auVar277._4_4_) < 1e-18);
      uVar64 = -(uint)(auVar277._8_4_ < 0.0 || ABS(auVar277._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar277._12_4_ < 0.0 || ABS(auVar277._12_4_) < 1e-18);
      auVar232._0_8_ = CONCAT44(uVar65,uVar63) & 0xff800000ff800000;
      auVar232._8_4_ = uVar64 & 0xff800000;
      auVar232._12_4_ = uVar66 & 0xff800000;
      auVar86._0_4_ = ~uVar63 & (uint)fVar176;
      auVar86._4_4_ = ~uVar65 & (uint)fVar179;
      auVar86._8_4_ = ~uVar64 & (uint)fVar199;
      auVar86._12_4_ = ~uVar66 & (uint)fVar202;
      auVar158 = maxps(auVar260,auVar86 | auVar232);
      uVar63 = -(uint)(0.0 < auVar277._0_4_ || ABS(auVar277._0_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar277._4_4_ || ABS(auVar277._4_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar277._8_4_ || ABS(auVar277._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar277._12_4_ || ABS(auVar277._12_4_) < 1e-18);
      auVar87._0_8_ = CONCAT44(uVar65,uVar63) & 0x7f8000007f800000;
      auVar87._8_4_ = uVar64 & 0x7f800000;
      auVar87._12_4_ = uVar66 & 0x7f800000;
      auVar278._0_4_ = ~uVar63 & (uint)fVar176;
      auVar278._4_4_ = ~uVar65 & (uint)fVar179;
      auVar278._8_4_ = ~uVar64 & (uint)fVar199;
      auVar278._12_4_ = ~uVar66 & (uint)fVar202;
      auVar294 = minps(auVar294,auVar278 | auVar87);
      auVar206._0_4_ =
           (0.0 - fVar351) * (float)((uint)fVar309 ^ uVar256) +
           (0.0 - fVar325) * (float)((uint)fVar197 ^ uVar256);
      auVar206._4_4_ =
           (0.0 - fVar352) * (float)((uint)fVar312 ^ uVar269) +
           (0.0 - fVar328) * (float)((uint)fVar200 ^ uVar269);
      auVar206._8_4_ =
           (0.0 - fVar353) * (float)((uint)fVar315 ^ uVar272) +
           (0.0 - fVar331) * (float)((uint)fVar211 ^ uVar272);
      auVar206._12_4_ = fVar213 * 0.0 + fVar213 * 0.0;
      auVar160._0_4_ =
           (float)((uint)fVar282 ^ uVar256) * fVar141 +
           (float)((uint)fVar309 ^ uVar256) * fVar140 + (float)((uint)fVar197 ^ uVar256) * fVar150;
      auVar160._4_4_ =
           (float)((uint)fVar286 ^ uVar269) * fVar141 +
           (float)((uint)fVar312 ^ uVar269) * fVar140 + (float)((uint)fVar200 ^ uVar269) * fVar150;
      auVar160._8_4_ =
           (float)((uint)fVar289 ^ uVar272) * fVar141 +
           (float)((uint)fVar315 ^ uVar272) * fVar140 + (float)((uint)fVar211 ^ uVar272) * fVar150;
      auVar160._12_4_ = fVar213 * fVar141 + fVar213 * fVar140 + fVar213 * fVar150;
      auVar260 = rcpps(auVar206,auVar160);
      fVar176 = auVar260._0_4_;
      fVar179 = auVar260._4_4_;
      fVar197 = auVar260._8_4_;
      fVar199 = auVar260._12_4_;
      fVar176 = (((float)DAT_01f46a60 - auVar160._0_4_ * fVar176) * fVar176 + fVar176) *
                (float)((uint)((0.0 - fVar339) * (float)((uint)fVar282 ^ uVar256) + auVar206._0_4_)
                       ^ uVar256);
      fVar179 = ((DAT_01f46a60._4_4_ - auVar160._4_4_ * fVar179) * fVar179 + fVar179) *
                (float)((uint)((0.0 - fVar342) * (float)((uint)fVar286 ^ uVar269) + auVar206._4_4_)
                       ^ uVar269);
      fVar197 = ((DAT_01f46a60._8_4_ - auVar160._8_4_ * fVar197) * fVar197 + fVar197) *
                (float)((uint)((0.0 - fVar345) * (float)((uint)fVar289 ^ uVar272) + auVar206._8_4_)
                       ^ uVar272);
      fVar199 = ((DAT_01f46a60._12_4_ - auVar160._12_4_ * fVar199) * fVar199 + fVar199) *
                (float)((uint)(fVar213 * 0.0 + auVar206._12_4_) ^ (uint)fVar213);
      uVar63 = -(uint)(auVar160._0_4_ < 0.0 || ABS(auVar160._0_4_) < 1e-18);
      uVar65 = -(uint)(auVar160._4_4_ < 0.0 || ABS(auVar160._4_4_) < 1e-18);
      uVar64 = -(uint)(auVar160._8_4_ < 0.0 || ABS(auVar160._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar160._12_4_ < 0.0 || ABS(auVar160._12_4_) < 1e-18);
      auVar207._0_8_ = CONCAT44(uVar65,uVar63) & 0xff800000ff800000;
      auVar207._8_4_ = uVar64 & 0xff800000;
      auVar207._12_4_ = uVar66 & 0xff800000;
      auVar88._0_4_ = ~uVar63 & (uint)fVar176;
      auVar88._4_4_ = ~uVar65 & (uint)fVar179;
      auVar88._8_4_ = ~uVar64 & (uint)fVar197;
      auVar88._12_4_ = ~uVar66 & (uint)fVar199;
      auVar208._0_12_ = ZEXT812(0);
      auVar208._12_4_ = 0.0;
      auVar158 = maxps(auVar158,auVar88 | auVar207);
      uVar63 = -(uint)(0.0 < auVar160._0_4_ || ABS(auVar160._0_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar160._4_4_ || ABS(auVar160._4_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar160._8_4_ || ABS(auVar160._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar160._12_4_ || ABS(auVar160._12_4_) < 1e-18);
      auVar295._0_8_ = CONCAT44(uVar65,uVar63) & 0x7f8000007f800000;
      auVar295._8_4_ = uVar64 & 0x7f800000;
      auVar295._12_4_ = uVar66 & 0x7f800000;
      auVar161._0_4_ = ~uVar63 & (uint)fVar176;
      auVar161._4_4_ = ~uVar65 & (uint)fVar179;
      auVar161._8_4_ = ~uVar64 & (uint)fVar197;
      auVar161._12_4_ = ~uVar66 & (uint)fVar199;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar294,auVar161 | auVar295);
      fVar176 = auVar158._12_4_;
      fVar179 = auVar158._0_4_;
      fVar197 = auVar158._4_4_;
      fVar199 = auVar158._8_4_;
      auVar359._0_4_ = -(uint)(fVar179 <= tp1.upper.field_0._0_4_) & auVar186._0_4_;
      auVar359._4_4_ = -(uint)(fVar197 <= tp1.upper.field_0._4_4_) & auVar186._4_4_;
      auVar359._8_4_ = -(uint)(fVar199 <= tp1.upper.field_0._8_4_) & auVar186._8_4_;
      auVar359._12_4_ = -(uint)(fVar176 <= tp1.upper.field_0._12_4_) & auVar186._12_4_;
      iVar47 = movmskps(iVar47,auVar359);
      if (iVar47 == 0) goto LAB_0031a34e;
      auVar294 = maxps(ZEXT816(0),_local_658);
      auVar25._4_4_ = fStack_214;
      auVar25._0_4_ = local_218;
      auVar25._8_4_ = fStack_210;
      auVar25._12_4_ = fStack_20c;
      auVar260 = minps(auVar25,_DAT_01f46a60);
      auVar243 = maxps(auVar260,auVar208);
      auVar26._4_4_ = fStack_204;
      auVar26._0_4_ = local_208;
      auVar26._8_4_ = fStack_200;
      auVar26._12_4_ = fStack_1fc;
      auVar260 = minps(auVar26,_DAT_01f46a60);
      auVar260 = maxps(auVar260,auVar208);
      local_108[0] = (auVar243._0_4_ + (float)DAT_01f4be10) * (float)DAT_01f4bdb0 * fVar178 +
                     fVar152;
      local_108[1] = (auVar243._4_4_ + DAT_01f4be10._4_4_) * DAT_01f4bdb0._4_4_ * fVar178 + fVar152;
      local_108[2] = (auVar243._8_4_ + DAT_01f4be10._8_4_) * DAT_01f4bdb0._8_4_ * fVar178 + fVar152;
      local_108[3] = (auVar243._12_4_ + DAT_01f4be10._12_4_) * DAT_01f4bdb0._12_4_ * fVar178 +
                     fVar152;
      local_118[0] = (auVar260._0_4_ + (float)DAT_01f4be10) * (float)DAT_01f4bdb0 * fVar178 +
                     fVar152;
      local_118[1] = (auVar260._4_4_ + DAT_01f4be10._4_4_) * DAT_01f4bdb0._4_4_ * fVar178 + fVar152;
      local_118[2] = (auVar260._8_4_ + DAT_01f4be10._8_4_) * DAT_01f4bdb0._8_4_ * fVar178 + fVar152;
      local_118[3] = (auVar260._12_4_ + DAT_01f4be10._12_4_) * DAT_01f4bdb0._12_4_ * fVar178 +
                     fVar152;
      fVar330 = fVar330 - auVar294._0_4_ * auVar294._0_4_;
      fVar341 = fVar341 - auVar294._4_4_ * auVar294._4_4_;
      fVar153 = fVar153 - auVar294._8_4_ * auVar294._8_4_;
      fVar173 = fVar173 - auVar294._12_4_ * auVar294._12_4_;
      auVar89._0_4_ = fVar327 * fVar327 - auVar261._0_4_ * 4.0 * fVar330;
      auVar89._4_4_ = fVar338 * fVar338 - auVar261._4_4_ * 4.0 * fVar341;
      auVar89._8_4_ = fVar151 * fVar151 - auVar261._8_4_ * 4.0 * fVar153;
      auVar89._12_4_ = fVar156 * fVar156 - auVar261._12_4_ * 4.0 * fVar173;
      auVar323._4_4_ = -(uint)(0.0 <= auVar89._4_4_);
      auVar323._0_4_ = -(uint)(0.0 <= auVar89._0_4_);
      auVar323._8_4_ = -(uint)(0.0 <= auVar89._8_4_);
      auVar323._12_4_ = -(uint)(0.0 <= auVar89._12_4_);
      iVar47 = movmskps(iVar47,auVar323);
      if (iVar47 == 0) {
        _local_658 = ZEXT816(0);
        fVar333 = 0.0;
        fVar344 = 0.0;
        fVar154 = 0.0;
        fVar175 = 0.0;
        fVar327 = 0.0;
        fVar338 = 0.0;
        fVar151 = 0.0;
        fVar156 = 0.0;
        fVar200 = 0.0;
        fVar202 = 0.0;
        fVar211 = 0.0;
        fVar213 = 0.0;
        _local_5a8 = ZEXT816(0);
        iVar47 = 0;
        auVar244 = _DAT_01f45a40;
        auVar264 = _DAT_01f45a30;
      }
      else {
        auVar294 = sqrtps(_DAT_01f4be10,auVar89);
        auVar123._0_4_ = auVar261._0_4_ + auVar261._0_4_;
        auVar123._4_4_ = auVar261._4_4_ + auVar261._4_4_;
        auVar123._8_4_ = auVar261._8_4_ + auVar261._8_4_;
        auVar123._12_4_ = auVar261._12_4_ + auVar261._12_4_;
        auVar260 = rcpps(_DAT_01f4bdb0,auVar123);
        fVar178 = auVar260._0_4_;
        fVar275 = auVar260._4_4_;
        fVar285 = auVar260._8_4_;
        fVar292 = auVar260._12_4_;
        fVar178 = ((float)DAT_01f46a60 - auVar123._0_4_ * fVar178) * fVar178 + fVar178;
        fVar275 = (DAT_01f46a60._4_4_ - auVar123._4_4_ * fVar275) * fVar275 + fVar275;
        fVar285 = (DAT_01f46a60._8_4_ - auVar123._8_4_ * fVar285) * fVar285 + fVar285;
        fVar292 = (DAT_01f46a60._12_4_ - auVar123._12_4_ * fVar292) * fVar292 + fVar292;
        fVar289 = (-fVar327 - auVar294._0_4_) * fVar178;
        fVar304 = (-fVar338 - auVar294._4_4_) * fVar275;
        fVar309 = (-fVar151 - auVar294._8_4_) * fVar285;
        fVar312 = (-fVar156 - auVar294._12_4_) * fVar292;
        fVar178 = (auVar294._0_4_ - fVar327) * fVar178;
        fVar275 = (auVar294._4_4_ - fVar338) * fVar275;
        fVar285 = (auVar294._8_4_ - fVar151) * fVar285;
        fVar292 = (auVar294._12_4_ - fVar156) * fVar292;
        fVar300 = (fVar314 * fVar289 + fVar216) * fVar333;
        fVar313 = (fVar283 * fVar304 + fVar236) * fVar344;
        fVar282 = (fVar287 * fVar309 + fVar239) * fVar154;
        fVar286 = (fVar290 * fVar312 + fVar252) * fVar175;
        fVar327 = fVar141 * fVar289 - (fVar214 * fVar300 + fVar334);
        fVar338 = fVar141 * fVar304 - (fVar234 * fVar313 + fVar339);
        fVar151 = fVar141 * fVar309 - (fVar237 * fVar282 + fVar342);
        fVar156 = fVar141 * fVar312 - (fVar250 * fVar286 + fVar345);
        fVar200 = fVar140 * fVar289 - (fVar253 * fVar300 + fVar347);
        fVar202 = fVar140 * fVar304 - (fVar281 * fVar313 + fVar351);
        fVar211 = fVar140 * fVar309 - (fVar288 * fVar282 + fVar352);
        fVar213 = fVar140 * fVar312 - (fVar298 * fVar286 + fVar353);
        local_5a8._4_4_ = fVar150 * fVar304 - (fVar313 * fVar361 + fVar325);
        local_5a8._0_4_ = fVar150 * fVar289 - (fVar300 * fVar354 + fVar317);
        fStack_5a0 = fVar150 * fVar309 - (fVar282 * fVar362 + fVar328);
        fStack_59c = fVar150 * fVar312 - (fVar286 * fVar363 + fVar331);
        fVar333 = (fVar314 * fVar178 + fVar216) * fVar333;
        fVar344 = (fVar283 * fVar275 + fVar236) * fVar344;
        fVar154 = (fVar287 * fVar285 + fVar239) * fVar154;
        fVar175 = (fVar290 * fVar292 + fVar252) * fVar175;
        local_658._4_4_ = fVar141 * fVar275 - (fVar234 * fVar344 + fVar339);
        local_658._0_4_ = fVar141 * fVar178 - (fVar214 * fVar333 + fVar334);
        fStack_650 = fVar141 * fVar285 - (fVar237 * fVar154 + fVar342);
        fStack_64c = fVar141 * fVar292 - (fVar250 * fVar175 + fVar345);
        auVar208._0_4_ = fVar140 * fVar178 - (fVar253 * fVar333 + fVar347);
        auVar208._4_4_ = fVar140 * fVar275 - (fVar281 * fVar344 + fVar351);
        auVar208._8_4_ = fVar140 * fVar285 - (fVar288 * fVar154 + fVar352);
        auVar208._12_4_ = fVar140 * fVar292 - (fVar298 * fVar175 + fVar353);
        bVar60 = 0.0 <= auVar89._0_4_;
        uVar63 = -(uint)bVar60;
        bVar11 = 0.0 <= auVar89._4_4_;
        uVar65 = -(uint)bVar11;
        bVar12 = 0.0 <= auVar89._8_4_;
        uVar64 = -(uint)bVar12;
        bVar13 = 0.0 <= auVar89._12_4_;
        uVar66 = -(uint)bVar13;
        fVar333 = fVar150 * fVar178 - (fVar333 * fVar354 + fVar317);
        fVar344 = fVar150 * fVar275 - (fVar344 * fVar361 + fVar325);
        fVar154 = fVar150 * fVar285 - (fVar154 * fVar362 + fVar328);
        fVar175 = fVar150 * fVar292 - (fVar175 * fVar363 + fVar331);
        auVar306._0_4_ = (uint)fVar289 & uVar63;
        auVar306._4_4_ = (uint)fVar304 & uVar65;
        auVar306._8_4_ = (uint)fVar309 & uVar64;
        auVar306._12_4_ = (uint)fVar312 & uVar66;
        auVar264._0_8_ = CONCAT44(~uVar65,~uVar63) & 0x7f8000007f800000;
        auVar264._8_4_ = ~uVar64 & 0x7f800000;
        auVar264._12_4_ = ~uVar66 & 0x7f800000;
        auVar264 = auVar264 | auVar306;
        auVar187._0_4_ = (uint)fVar178 & uVar63;
        auVar187._4_4_ = (uint)fVar275 & uVar65;
        auVar187._8_4_ = (uint)fVar285 & uVar64;
        auVar187._12_4_ = (uint)fVar292 & uVar66;
        auVar244._0_8_ = CONCAT44(~uVar65,~uVar63) & 0xff800000ff800000;
        auVar244._8_4_ = ~uVar64 & 0xff800000;
        auVar244._12_4_ = ~uVar66 & 0xff800000;
        auVar244 = auVar244 | auVar187;
        auVar24._4_4_ = fVar210;
        auVar24._0_4_ = fVar172;
        auVar24._8_4_ = fVar212;
        auVar24._12_4_ = fVar254;
        auVar260 = maxps(auVar24,auVar145);
        fVar178 = auVar260._0_4_ * 1.9073486e-06;
        fVar214 = auVar260._4_4_ * 1.9073486e-06;
        fVar216 = auVar260._8_4_ * 1.9073486e-06;
        fVar234 = auVar260._12_4_ * 1.9073486e-06;
        auVar188._0_4_ = -(uint)(fVar301 < fVar178 && bVar60);
        auVar188._4_4_ = -(uint)(fVar303 < fVar214 && bVar11);
        auVar188._8_4_ = -(uint)(fVar308 < fVar216 && bVar12);
        auVar188._12_4_ = -(uint)(fVar311 < fVar234 && bVar13);
        iVar47 = movmskps(iVar47,auVar188);
        if (iVar47 != 0) {
          uVar63 = -(uint)(fVar330 <= 0.0);
          uVar65 = -(uint)(fVar341 <= 0.0);
          uVar64 = -(uint)(fVar153 <= 0.0);
          uVar66 = -(uint)(fVar173 <= 0.0);
          auVar279._0_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar188._0_4_;
          auVar279._4_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar188._4_4_;
          auVar279._8_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar188._8_4_;
          auVar279._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar188._12_4_;
          auVar296._0_4_ = ~auVar188._0_4_ & auVar264._0_4_;
          auVar296._4_4_ = ~auVar188._4_4_ & auVar264._4_4_;
          auVar296._8_4_ = ~auVar188._8_4_ & auVar264._8_4_;
          auVar296._12_4_ = ~auVar188._12_4_ & auVar264._12_4_;
          auVar266._0_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar188._0_4_;
          auVar266._4_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar188._4_4_;
          auVar266._8_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar188._8_4_;
          auVar266._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar188._12_4_;
          auVar195._0_4_ = ~auVar188._0_4_ & auVar244._0_4_;
          auVar195._4_4_ = ~auVar188._4_4_ & auVar244._4_4_;
          auVar195._8_4_ = ~auVar188._8_4_ & auVar244._8_4_;
          auVar195._12_4_ = ~auVar188._12_4_ & auVar244._12_4_;
          auVar323._4_4_ = -(uint)((fVar214 <= fVar303 || fVar341 <= 0.0) && bVar11);
          auVar323._0_4_ = -(uint)((fVar178 <= fVar301 || fVar330 <= 0.0) && bVar60);
          auVar323._8_4_ = -(uint)((fVar216 <= fVar308 || fVar153 <= 0.0) && bVar12);
          auVar323._12_4_ = -(uint)((fVar234 <= fVar311 || fVar173 <= 0.0) && bVar13);
          auVar244 = auVar195 | auVar266;
          auVar264 = auVar296 | auVar279;
        }
      }
      auVar260 = minps((undefined1  [16])tp1.upper.field_0,auVar264);
      aVar265 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar158,auVar244);
      tp1.lower.field_0 = aVar265;
      auVar162._0_8_ =
           CONCAT44(-(uint)(fVar197 <= auVar260._4_4_) & auVar359._4_4_,
                    -(uint)(fVar179 <= auVar260._0_4_) & auVar359._0_4_);
      auVar162._8_4_ = -(uint)(fVar199 <= auVar260._8_4_) & auVar359._8_4_;
      auVar162._12_4_ = -(uint)(fVar176 <= auVar260._12_4_) & auVar359._12_4_;
      uVar63 = -(uint)(aVar265.v[0] <= tp1.upper.field_0._0_4_) & auVar359._0_4_;
      uVar65 = -(uint)(aVar265.v[1] <= tp1.upper.field_0._4_4_) & auVar359._4_4_;
      auVar90._4_4_ = uVar65;
      auVar90._0_4_ = uVar63;
      uVar64 = -(uint)(aVar265.v[2] <= tp1.upper.field_0._8_4_) & auVar359._8_4_;
      uVar66 = -(uint)(aVar265.v[3] <= tp1.upper.field_0._12_4_) & auVar359._12_4_;
      auVar90._8_4_ = uVar64;
      auVar90._12_4_ = uVar66;
      iVar47 = movmskps(iVar47,auVar90 | auVar162);
      uVar57 = CONCAT44((int)((ulong)pSVar50 >> 0x20),iVar47);
      if (iVar47 != 0) {
        auVar146._0_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS((float)local_5a8._0_4_ * fVar150 + fVar200 * fVar140
                                               + fVar327 * fVar141)) & auVar323._0_4_) << 0x1f) >>
                    0x1f) + 4);
        auVar146._4_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS((float)local_5a8._4_4_ * fVar150 + fVar202 * fVar140
                                               + fVar338 * fVar141)) & auVar323._4_4_) << 0x1f) >>
                    0x1f) + 4);
        auVar146._8_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS(fStack_5a0 * fVar150 + fVar211 * fVar140 +
                                               fVar151 * fVar141)) & auVar323._8_4_) << 0x1f) >>
                    0x1f) + 4);
        auVar146._12_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS(fStack_59c * fVar150 + fVar213 * fVar140 +
                                               fVar156 * fVar141)) & auVar323._12_4_) << 0x1f) >>
                    0x1f) + 4);
        auVar91 = ~auVar146 & auVar162;
        auVar189._8_4_ = auVar162._8_4_;
        auVar189._0_8_ = auVar162._0_8_;
        auVar189._12_4_ = auVar162._12_4_;
        while( true ) {
          vVar46.field_0 = tp1.lower.field_0;
          local_398 = auVar91;
          uVar49 = (undefined4)(uVar57 >> 0x20);
          iVar47 = movmskps((int)uVar57,auVar91);
          uVar57 = CONCAT44(uVar49,iVar47);
          if (iVar47 == 0) break;
          uVar256 = auVar91._0_4_;
          uVar269 = auVar91._4_4_;
          uVar272 = auVar91._8_4_;
          uVar103 = auVar91._12_4_;
          auVar124._0_4_ = uVar256 & (uint)fVar179;
          auVar124._4_4_ = uVar269 & (uint)fVar197;
          auVar124._8_4_ = uVar272 & (uint)fVar199;
          auVar124._12_4_ = uVar103 & (uint)fVar176;
          auVar147._0_8_ = CONCAT44(~uVar269,~uVar256) & 0x7f8000007f800000;
          auVar147._8_4_ = ~uVar272 & 0x7f800000;
          auVar147._12_4_ = ~uVar103 & 0x7f800000;
          auVar147 = auVar147 | auVar124;
          auVar163._4_4_ = auVar147._0_4_;
          auVar163._0_4_ = auVar147._4_4_;
          auVar163._8_4_ = auVar147._12_4_;
          auVar163._12_4_ = auVar147._8_4_;
          auVar68 = minps(auVar163,auVar147);
          auVar125._0_8_ = auVar68._8_8_;
          auVar125._8_4_ = auVar68._0_4_;
          auVar125._12_4_ = auVar68._4_4_;
          auVar68 = minps(auVar125,auVar68);
          auVar126._0_8_ =
               CONCAT44(-(uint)(auVar68._4_4_ == auVar147._4_4_) & uVar269,
                        -(uint)(auVar68._0_4_ == auVar147._0_4_) & uVar256);
          auVar126._8_4_ = -(uint)(auVar68._8_4_ == auVar147._8_4_) & uVar272;
          auVar126._12_4_ = -(uint)(auVar68._12_4_ == auVar147._12_4_) & uVar103;
          iVar47 = movmskps(iVar47,auVar126);
          if (iVar47 != 0) {
            auVar91._8_4_ = auVar126._8_4_;
            auVar91._0_8_ = auVar126._0_8_;
            auVar91._12_4_ = auVar126._12_4_;
          }
          uVar48 = movmskps(iVar47,auVar91);
          uVar51 = CONCAT44(uVar49,uVar48);
          uVar57 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
          *(undefined4 *)(local_398 + uVar57 * 4) = 0;
          auVar15._4_4_ = fVar215;
          auVar15._0_4_ = fVar198;
          auVar15._8_4_ = fVar233;
          auVar15._12_4_ = fVar235;
          auVar21._4_4_ = fVar310;
          auVar21._0_4_ = fVar307;
          auVar21._8_4_ = fVar316;
          auVar21._12_4_ = fVar324;
          auVar158 = minps(auVar15,auVar21);
          auVar260 = maxps(auVar15,auVar21);
          auVar19._4_4_ = fVar291;
          auVar19._0_4_ = fVar284;
          auVar19._8_4_ = fVar297;
          auVar19._12_4_ = fVar299;
          auVar17._4_4_ = fVar251;
          auVar17._0_4_ = fVar249;
          auVar17._8_4_ = fVar177;
          auVar17._12_4_ = fVar302;
          auVar68 = minps(auVar19,auVar17);
          auVar158 = minps(auVar158,auVar68);
          auVar68 = maxps(auVar19,auVar17);
          auVar260 = maxps(auVar260,auVar68);
          auVar164._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
          auVar164._8_4_ = auVar158._8_4_ & 0x7fffffff;
          auVar164._12_4_ = auVar158._12_4_ & 0x7fffffff;
          auVar92._0_8_ = auVar260._0_8_ & 0x7fffffff7fffffff;
          auVar92._8_4_ = auVar260._8_4_ & 0x7fffffff;
          auVar92._12_4_ = ABS(auVar260._12_4_);
          auVar68 = maxps(auVar164,auVar92);
          fVar327 = auVar68._4_4_;
          if (auVar68._4_4_ <= auVar68._0_4_) {
            fVar327 = auVar68._0_4_;
          }
          auVar165._8_8_ = auVar68._8_8_;
          auVar165._0_8_ = auVar68._8_8_;
          if (auVar68._8_4_ <= fVar327) {
            auVar165._0_4_ = fVar327;
          }
          fVar338 = auVar165._0_4_ * 1.9073486e-06;
          fVar327 = local_108[uVar57];
          fVar330 = local_118[uVar57 - 8];
          lVar56 = 5;
          do {
            bVar60 = lVar56 == 0;
            lVar56 = lVar56 + -1;
            if (bVar60) goto LAB_0031ac4c;
            fVar173 = SQRT(fVar238) * 1.9073486e-06 * fVar330;
            fVar341 = 1.0 - fVar327;
            fVar153 = fVar307 * fVar341 + fVar284 * fVar327;
            fVar156 = fVar310 * fVar341 + fVar291 * fVar327;
            fVar200 = fVar316 * fVar341 + fVar297 * fVar327;
            fVar211 = fVar324 * fVar341 + fVar299 * fVar327;
            fVar202 = (fVar198 * fVar341 + fVar307 * fVar327) * fVar341 + fVar327 * fVar153;
            fVar213 = (fVar215 * fVar341 + fVar310 * fVar327) * fVar341 + fVar327 * fVar156;
            fVar178 = (fVar233 * fVar341 + fVar316 * fVar327) * fVar341 + fVar327 * fVar200;
            fVar151 = (fVar235 * fVar341 + fVar324 * fVar327) * fVar341 + fVar327 * fVar211;
            fVar234 = fVar153 * fVar341 + (fVar284 * fVar341 + fVar249 * fVar327) * fVar327;
            fVar237 = fVar156 * fVar341 + (fVar291 * fVar341 + fVar251 * fVar327) * fVar327;
            fVar250 = fVar200 * fVar341 + (fVar297 * fVar341 + fVar177 * fVar327) * fVar327;
            fVar153 = fVar211 * fVar341 + (fVar299 * fVar341 + fVar302 * fVar327) * fVar327;
            fVar216 = fVar341 * fVar151 + fVar327 * fVar153;
            fVar236 = (fVar234 - fVar202) * 3.0;
            fVar239 = (fVar237 - fVar213) * 3.0;
            fVar252 = (fVar250 - fVar178) * 3.0;
            fVar253 = (fVar153 - fVar151) * 3.0;
            fVar151 = fVar341 * 6.0;
            fVar211 = (fVar327 - (fVar341 + fVar341)) * 6.0;
            fVar214 = (fVar341 - (fVar327 + fVar327)) * 6.0;
            fVar200 = fVar327 * 6.0;
            fVar153 = fVar151 * fVar198 + fVar211 * fVar307 + fVar214 * fVar284 + fVar200 * fVar249;
            fVar156 = fVar151 * fVar215 + fVar211 * fVar310 + fVar214 * fVar291 + fVar200 * fVar251;
            fVar151 = fVar151 * fVar233 + fVar211 * fVar316 + fVar214 * fVar297 + fVar200 * fVar177;
            fVar200 = (fVar330 * fVar105 + 0.0) - (fVar341 * fVar202 + fVar327 * fVar234);
            fVar202 = (fVar330 * fVar140 + 0.0) - (fVar341 * fVar213 + fVar327 * fVar237);
            fVar211 = (fVar330 * fVar150 + 0.0) - (fVar341 * fVar178 + fVar327 * fVar250);
            fVar213 = (fVar330 * 0.0 + 0.0) - fVar216;
            fVar341 = fVar202 * fVar202;
            fStack_640 = fVar211 * fVar211;
            fStack_63c = fVar213 * fVar213;
            local_648._0_4_ = fVar341 + fVar200 * fVar200 + fStack_640;
            local_648._4_4_ = fVar341 + fVar341 + fStack_63c;
            fStack_640 = fVar341 + fStack_640 + fStack_640;
            fStack_63c = fVar341 + fStack_63c + fStack_63c;
            fVar341 = fVar338;
            if (fVar338 <= fVar173) {
              fVar341 = fVar173;
            }
            fVar178 = fVar239 * fVar239 + fVar236 * fVar236 + fVar252 * fVar252;
            auVar68 = ZEXT416((uint)fVar178);
            auVar158 = rsqrtss(ZEXT416((uint)fVar178),auVar68);
            fVar173 = auVar158._0_4_;
            fVar214 = fVar173 * 1.5 - fVar173 * fVar173 * fVar178 * 0.5 * fVar173;
            fVar281 = fVar236 * fVar214;
            fVar285 = fVar239 * fVar214;
            fVar288 = fVar252 * fVar214;
            fVar292 = fVar253 * fVar214;
            fVar275 = fVar252 * fVar151 + fVar239 * fVar156 + fVar236 * fVar153;
            auVar68 = rcpss(auVar68,auVar68);
            fVar173 = (2.0 - fVar178 * auVar68._0_4_) * auVar68._0_4_;
            fVar234 = fVar202 * fVar285;
            fVar237 = fVar211 * fVar288;
            fVar250 = fVar213 * fVar292;
            fVar300 = fVar234 + fVar200 * fVar281 + fVar237;
            fVar301 = fVar234 + fVar234 + fVar250;
            fVar237 = fVar234 + fVar237 + fVar237;
            fVar250 = fVar234 + fVar250 + fVar250;
            fVar234 = (SQRT((float)local_648._0_4_) + 1.0) * (fVar338 / SQRT(fVar178)) +
                      SQRT((float)local_648._0_4_) * fVar338 + fVar341;
            fVar298 = fVar292 * -fVar253;
            fVar173 = fVar288 * -fVar252 + fVar285 * -fVar239 + fVar281 * -fVar236 +
                      fVar173 * (fVar178 * fVar151 - fVar275 * fVar252) * fVar214 * fVar211 +
                      fVar173 * (fVar178 * fVar156 - fVar275 * fVar239) * fVar214 * fVar202 +
                      fVar173 * (fVar178 * fVar153 - fVar275 * fVar236) * fVar214 * fVar200;
            fVar178 = fVar150 * fVar288 + fVar140 * fVar285 + fVar105 * fVar281;
            fVar151 = (float)local_648._0_4_ - fVar300 * fVar300;
            auVar93._0_8_ = CONCAT44((float)local_648._4_4_ - fVar301 * fVar301,fVar151);
            auVar93._8_4_ = fStack_640 - fVar237 * fVar237;
            auVar93._12_4_ = fStack_63c - fVar250 * fVar250;
            fVar156 = -fVar253 * fVar213;
            local_678 = CONCAT44(fVar298,fVar173);
            auVar127._8_4_ = auVar93._8_4_;
            auVar127._0_8_ = auVar93._0_8_;
            auVar127._12_4_ = auVar93._12_4_;
            auVar68 = rsqrtss(auVar127,auVar93);
            fVar153 = auVar68._0_4_;
            fVar153 = fVar153 * 1.5 - fVar153 * fVar153 * fVar151 * 0.5 * fVar153;
            if (fVar151 < 0.0) {
              fVar151 = sqrtf(fVar151);
              uVar57 = extraout_RAX;
              p_Var55 = extraout_RDX;
            }
            else {
              fVar151 = SQRT(fVar151);
            }
            fVar151 = fVar151 - fVar216;
            fVar214 = ((-fVar252 * fVar211 + -fVar239 * fVar202 + -fVar236 * fVar200) -
                      fVar300 * fVar173) * fVar153 - fVar253;
            fVar153 = ((fVar150 * fVar211 + fVar140 * fVar202 + fVar105 * fVar200) -
                      fVar300 * fVar178) * fVar153;
            auVar166._0_4_ = fVar173 * fVar153 - fVar178 * fVar214;
            auVar191._8_4_ = -fVar156;
            auVar191._0_8_ = CONCAT44(fVar156,fVar214) ^ 0x8000000000000000;
            auVar191._12_4_ = fVar213 * 0.0;
            auVar190._8_8_ = auVar191._8_8_;
            auVar190._0_8_ = CONCAT44(fVar153,fVar214) ^ 0x80000000;
            auVar166._4_4_ = auVar166._0_4_;
            auVar166._8_4_ = auVar166._0_4_;
            auVar166._12_4_ = auVar166._0_4_;
            auVar68 = divps(auVar190,auVar166);
            auVar246._8_4_ = fVar298;
            auVar246._0_8_ = local_678;
            auVar246._12_4_ = -(fVar292 * 0.0);
            auVar245._8_8_ = auVar246._8_8_;
            auVar245._0_8_ = CONCAT44(fVar178,fVar173) ^ 0x8000000000000000;
            auVar158 = divps(auVar245,auVar166);
            fVar330 = fVar330 - (fVar151 * auVar158._0_4_ + fVar300 * auVar68._0_4_);
            fVar327 = fVar327 - (fVar151 * auVar158._4_4_ + fVar300 * auVar68._4_4_);
          } while ((fVar234 <= ABS(fVar300)) ||
                  (auVar260._12_4_ * 1.9073486e-06 + fVar341 + fVar234 <= ABS(fVar151)));
          fVar330 = fVar196 + fVar330;
          if ((fVar142 <= fVar330) &&
             (((fVar338 = *(float *)(ray + k * 4 + 0x80), fVar330 <= fVar338 && (0.0 <= fVar327)) &&
              (fVar327 <= 1.0)))) {
            auVar68 = rsqrtss(_local_648,_local_648);
            fVar341 = auVar68._0_4_;
            pGVar9 = (context->scene->geometries).items[uVar61].ptr;
            uVar57 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar341 = fVar341 * 1.5 + fVar341 * fVar341 * (float)local_648._0_4_ * -0.5 * fVar341;
              fVar200 = fVar200 * fVar341;
              fVar202 = fVar202 * fVar341;
              fVar211 = fVar211 * fVar341;
              fVar341 = fVar253 * fVar200 + fVar236;
              fVar151 = fVar253 * fVar202 + fVar239;
              fVar153 = fVar253 * fVar211 + fVar252;
              fVar173 = fVar202 * fVar236 - fVar239 * fVar200;
              fVar202 = fVar211 * fVar239 - fVar252 * fVar202;
              fVar200 = fVar200 * fVar252 - fVar236 * fVar211;
              fVar156 = fVar151 * fVar202 - fVar200 * fVar341;
              fVar151 = fVar153 * fVar200 - fVar173 * fVar151;
              fVar341 = fVar341 * fVar173 - fVar202 * fVar153;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar330;
                *(float *)(ray + k * 4 + 0xc0) = fVar151;
                *(float *)(ray + k * 4 + 0xd0) = fVar341;
                *(float *)(ray + k * 4 + 0xe0) = fVar156;
                *(float *)(ray + k * 4 + 0xf0) = fVar327;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(int *)(ray + k * 4 + 0x110) = (int)local_5e0;
                *(uint *)(ray + k * 4 + 0x120) = uVar61;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar256 = context->user->instPrimID[0];
                uVar57 = (ulong)uVar256;
                *(uint *)(ray + k * 4 + 0x140) = uVar256;
              }
              else {
                local_388._4_4_ = fVar151;
                local_388._0_4_ = fVar151;
                fStack_380 = fVar151;
                fStack_37c = fVar151;
                local_378 = fVar341;
                fStack_374 = fVar341;
                fStack_370 = fVar341;
                fStack_36c = fVar341;
                local_368 = fVar156;
                fStack_364 = fVar156;
                fStack_360 = fVar156;
                fStack_35c = fVar156;
                local_358 = fVar327;
                fStack_354 = fVar327;
                fStack_350 = fVar327;
                fStack_34c = fVar327;
                local_348 = 0;
                uStack_340 = 0;
                local_338 = CONCAT44(uVar62,uVar62);
                uStack_330 = CONCAT44(uVar62,uVar62);
                local_328 = CONCAT44(uVar61,uVar61);
                uStack_320 = CONCAT44(uVar61,uVar61);
                local_318 = context->user->instID[0];
                uStack_314 = local_318;
                uStack_310 = local_318;
                uStack_30c = local_318;
                local_308 = context->user->instPrimID[0];
                uStack_304 = local_308;
                uStack_300 = local_308;
                uStack_2fc = local_308;
                *(float *)(ray + k * 4 + 0x80) = fVar330;
                local_5f8 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_5f8;
                args.geometryUserPtr = pGVar9->userPtr;
                args.context = context->user;
                args.ray = (RTCRayN *)ray;
                args.hit = (RTCHitN *)local_388;
                args.N = 4;
                p_Var55 = pGVar9->intersectionFilterN;
                auVar364._8_8_ = &local_318;
                auVar364._0_8_ = p_Var55;
                if (p_Var55 != (RTCFilterFunctionN)0x0) {
                  auVar364 = (*p_Var55)(&args);
                }
                p_Var55 = auVar364._8_8_;
                auVar128._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                auVar128._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                auVar128._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                auVar128._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                uVar256 = movmskps(auVar364._0_4_,auVar128);
                pRVar52 = (RTCRayN *)(ulong)(uVar256 ^ 0xf);
                if ((uVar256 ^ 0xf) == 0) {
                  auVar128 = auVar128 ^ _DAT_01f46b70;
                }
                else {
                  p_Var59 = context->args->filter;
                  auVar44._8_8_ = p_Var55;
                  auVar44._0_8_ = p_Var59;
                  auVar365._8_8_ = p_Var55;
                  auVar365._0_8_ = p_Var59;
                  if ((p_Var59 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (auVar365 = auVar44, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar365 = (*p_Var59)(&args);
                  }
                  p_Var55 = auVar365._8_8_;
                  auVar94._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                  auVar94._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                  auVar94._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                  auVar94._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                  auVar128 = auVar94 ^ _DAT_01f46b70;
                  uVar256 = movmskps(auVar365._0_4_,auVar94);
                  pRVar52 = (RTCRayN *)(ulong)(uVar256 ^ 0xf);
                  if ((uVar256 ^ 0xf) != 0) {
                    uVar256 = *(uint *)(args.hit + 4);
                    uVar269 = *(uint *)(args.hit + 8);
                    uVar272 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar94._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar94._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0xc4) & auVar94._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 200) & auVar94._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0xcc) & auVar94._12_4_;
                    uVar256 = *(uint *)(args.hit + 0x14);
                    uVar269 = *(uint *)(args.hit + 0x18);
                    uVar272 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar94._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0xd4) & auVar94._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 0xd8) & auVar94._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0xdc) & auVar94._12_4_;
                    uVar256 = *(uint *)(args.hit + 0x24);
                    uVar269 = *(uint *)(args.hit + 0x28);
                    uVar272 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar94._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0xe4) & auVar94._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 0xe8) & auVar94._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0xec) & auVar94._12_4_;
                    uVar256 = *(uint *)(args.hit + 0x34);
                    uVar269 = *(uint *)(args.hit + 0x38);
                    uVar272 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar94._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0xf4) & auVar94._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 0xf8) & auVar94._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0xfc) & auVar94._12_4_;
                    uVar256 = *(uint *)(args.hit + 0x44);
                    uVar269 = *(uint *)(args.hit + 0x48);
                    uVar272 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar94._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0x104) & auVar94._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 0x108) & auVar94._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0x10c) & auVar94._12_4_;
                    uVar256 = *(uint *)(args.hit + 0x54);
                    uVar269 = *(uint *)(args.hit + 0x58);
                    uVar272 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar94._0_4_ |
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar94._4_4_ | ~auVar94._4_4_ & uVar256;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar94._8_4_ | ~auVar94._8_4_ & uVar269;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar94._12_4_ | ~auVar94._12_4_ & uVar272;
                    uVar256 = *(uint *)(args.hit + 100);
                    uVar269 = *(uint *)(args.hit + 0x68);
                    uVar272 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar94._0_4_ |
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar94._4_4_ | ~auVar94._4_4_ & uVar256;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar94._8_4_ | ~auVar94._8_4_ & uVar269;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar94._12_4_ | ~auVar94._12_4_ & uVar272;
                    uVar256 = *(uint *)(args.hit + 0x74);
                    uVar269 = *(uint *)(args.hit + 0x78);
                    uVar272 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar94._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar94._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar94._4_4_ & uVar256 | *(uint *)(args.ray + 0x134) & auVar94._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar94._8_4_ & uVar269 | *(uint *)(args.ray + 0x138) & auVar94._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar94._12_4_ & uVar272 | *(uint *)(args.ray + 0x13c) & auVar94._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar94 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar94;
                    pRVar52 = args.ray;
                  }
                }
                auVar129._0_4_ = auVar128._0_4_ << 0x1f;
                auVar129._4_4_ = auVar128._4_4_ << 0x1f;
                auVar129._8_4_ = auVar128._8_4_ << 0x1f;
                auVar129._12_4_ = auVar128._12_4_ << 0x1f;
                iVar47 = movmskps((int)pRVar52,auVar129);
                uVar57 = CONCAT44((int)((ulong)pRVar52 >> 0x20),iVar47);
                if (iVar47 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar338;
                }
              }
            }
          }
LAB_0031ac4c:
          fVar318 = *(float *)(ray + k * 4 + 0x80);
          auVar91._0_4_ = -(uint)(fVar196 + fVar179 <= fVar318) & local_398._0_4_;
          auVar91._4_4_ = -(uint)(fVar196 + fVar197 <= fVar318) & local_398._4_4_;
          auVar91._8_4_ = -(uint)(fVar196 + fVar199 <= fVar318) & local_398._8_4_;
          auVar91._12_4_ = -(uint)(fVar196 + fVar176 <= fVar318) & local_398._12_4_;
          auVar189 = auVar162;
        }
        auVar148._0_4_ = -(uint)(aVar265.v[0] + fVar196 <= fVar318) & uVar63;
        auVar148._4_4_ = -(uint)(aVar265.v[1] + fVar196 <= fVar318) & uVar65;
        auVar148._8_4_ = -(uint)(aVar265.v[2] + fVar196 <= fVar318) & uVar64;
        auVar148._12_4_ = -(uint)(aVar265.v[3] + fVar196 <= fVar318) & uVar66;
        auVar95._0_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS((float)local_658._0_4_ * fVar141 +
                                               auVar208._0_4_ * fVar140 + fVar333 * fVar150)) &
                           auVar323._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar95._4_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS((float)local_658._4_4_ * fVar141 +
                                               auVar208._4_4_ * fVar140 + fVar344 * fVar150)) &
                           auVar323._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar95._8_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS(fStack_650 * fVar141 +
                                               auVar208._8_4_ * fVar140 + fVar154 * fVar150)) &
                           auVar323._8_4_) << 0x1f) >> 0x1f) + 4);
        auVar95._12_4_ =
             -(uint)((int)local_6ac <
                    ((int)((-(uint)(0.3 <= ABS(fStack_64c * fVar141 +
                                               auVar208._12_4_ * fVar140 + fVar175 * fVar150)) &
                           auVar323._12_4_) << 0x1f) >> 0x1f) + 4);
        auVar96 = ~auVar95 & auVar148;
        fVar327 = fVar196 + tp1.lower.field_0.v[0];
        fVar330 = fVar196 + tp1.lower.field_0.v[1];
        fVar333 = fVar196 + tp1.lower.field_0.v[2];
        fVar338 = fVar196 + tp1.lower.field_0.v[3];
        while( true ) {
          local_3a8 = auVar96;
          iVar47 = movmskps((int)uVar57,auVar96);
          if (iVar47 == 0) break;
          auVar158 = ~auVar96 & _DAT_01f45a30 | auVar96 & (undefined1  [16])vVar46.field_0;
          auVar167._4_4_ = auVar158._0_4_;
          auVar167._0_4_ = auVar158._4_4_;
          auVar167._8_4_ = auVar158._12_4_;
          auVar167._12_4_ = auVar158._8_4_;
          auVar68 = minps(auVar167,auVar158);
          auVar130._0_8_ = auVar68._8_8_;
          auVar130._8_4_ = auVar68._0_4_;
          auVar130._12_4_ = auVar68._4_4_;
          auVar68 = minps(auVar130,auVar68);
          auVar131._0_8_ =
               CONCAT44(-(uint)(auVar68._4_4_ == auVar158._4_4_) & auVar96._4_4_,
                        -(uint)(auVar68._0_4_ == auVar158._0_4_) & auVar96._0_4_);
          auVar131._8_4_ = -(uint)(auVar68._8_4_ == auVar158._8_4_) & auVar96._8_4_;
          auVar131._12_4_ = -(uint)(auVar68._12_4_ == auVar158._12_4_) & auVar96._12_4_;
          iVar47 = movmskps(iVar47,auVar131);
          if (iVar47 != 0) {
            auVar96._8_4_ = auVar131._8_4_;
            auVar96._0_8_ = auVar131._0_8_;
            auVar96._12_4_ = auVar131._12_4_;
          }
          uVar49 = movmskps(iVar47,auVar96);
          uVar51 = CONCAT44((int)(uVar57 >> 0x20),uVar49);
          uVar57 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
          *(undefined4 *)(local_3a8 + uVar57 * 4) = 0;
          auVar16._4_4_ = fVar215;
          auVar16._0_4_ = fVar198;
          auVar16._8_4_ = fVar233;
          auVar16._12_4_ = fVar235;
          auVar22._4_4_ = fVar310;
          auVar22._0_4_ = fVar307;
          auVar22._8_4_ = fVar316;
          auVar22._12_4_ = fVar324;
          auVar158 = minps(auVar16,auVar22);
          auVar260 = maxps(auVar16,auVar22);
          auVar20._4_4_ = fVar291;
          auVar20._0_4_ = fVar284;
          auVar20._8_4_ = fVar297;
          auVar20._12_4_ = fVar299;
          auVar18._4_4_ = fVar251;
          auVar18._0_4_ = fVar249;
          auVar18._8_4_ = fVar177;
          auVar18._12_4_ = fVar302;
          auVar68 = minps(auVar20,auVar18);
          auVar158 = minps(auVar158,auVar68);
          auVar68 = maxps(auVar20,auVar18);
          auVar260 = maxps(auVar260,auVar68);
          auVar168._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
          auVar168._8_4_ = auVar158._8_4_ & 0x7fffffff;
          auVar168._12_4_ = auVar158._12_4_ & 0x7fffffff;
          auVar97._0_8_ = auVar260._0_8_ & 0x7fffffff7fffffff;
          auVar97._8_4_ = auVar260._8_4_ & 0x7fffffff;
          auVar97._12_4_ = ABS(auVar260._12_4_);
          auVar68 = maxps(auVar168,auVar97);
          fVar341 = auVar68._4_4_;
          if (auVar68._4_4_ <= auVar68._0_4_) {
            fVar341 = auVar68._0_4_;
          }
          auVar169._8_8_ = auVar68._8_8_;
          auVar169._0_8_ = auVar68._8_8_;
          if (auVar68._8_4_ <= fVar341) {
            auVar169._0_4_ = fVar341;
          }
          fVar151 = auVar169._0_4_ * 1.9073486e-06;
          fVar341 = local_118[uVar57];
          fVar344 = tp1.upper.field_0.v[uVar57];
          lVar56 = 5;
          do {
            bVar60 = lVar56 == 0;
            lVar56 = lVar56 + -1;
            if (bVar60) goto LAB_0031b74e;
            fVar175 = SQRT(fVar238) * 1.9073486e-06 * fVar344;
            fVar153 = 1.0 - fVar341;
            fVar156 = fVar307 * fVar153 + fVar284 * fVar341;
            fVar173 = fVar310 * fVar153 + fVar291 * fVar341;
            fVar200 = fVar316 * fVar153 + fVar297 * fVar341;
            fVar211 = fVar324 * fVar153 + fVar299 * fVar341;
            fVar202 = (fVar198 * fVar153 + fVar307 * fVar341) * fVar153 + fVar341 * fVar156;
            fVar213 = (fVar215 * fVar153 + fVar310 * fVar341) * fVar153 + fVar341 * fVar173;
            fVar178 = (fVar233 * fVar153 + fVar316 * fVar341) * fVar153 + fVar341 * fVar200;
            fVar154 = (fVar235 * fVar153 + fVar324 * fVar341) * fVar153 + fVar341 * fVar211;
            fVar216 = fVar156 * fVar153 + (fVar284 * fVar153 + fVar249 * fVar341) * fVar341;
            fVar236 = fVar173 * fVar153 + (fVar291 * fVar153 + fVar251 * fVar341) * fVar341;
            fVar239 = fVar200 * fVar153 + (fVar297 * fVar153 + fVar177 * fVar341) * fVar341;
            fVar156 = fVar211 * fVar153 + (fVar299 * fVar153 + fVar302 * fVar341) * fVar341;
            fVar253 = fVar153 * fVar154 + fVar341 * fVar156;
            fVar234 = (fVar216 - fVar202) * 3.0;
            fVar237 = (fVar236 - fVar213) * 3.0;
            fVar250 = (fVar239 - fVar178) * 3.0;
            fVar252 = (fVar156 - fVar154) * 3.0;
            fVar154 = fVar153 * 6.0;
            fVar211 = (fVar341 - (fVar153 + fVar153)) * 6.0;
            fVar214 = (fVar153 - (fVar341 + fVar341)) * 6.0;
            fVar200 = fVar341 * 6.0;
            fVar156 = fVar154 * fVar198 + fVar211 * fVar307 + fVar214 * fVar284 + fVar200 * fVar249;
            fVar173 = fVar154 * fVar215 + fVar211 * fVar310 + fVar214 * fVar291 + fVar200 * fVar251;
            fVar154 = fVar154 * fVar233 + fVar211 * fVar316 + fVar214 * fVar297 + fVar200 * fVar177;
            fVar200 = (fVar344 * fVar105 + 0.0) - (fVar153 * fVar202 + fVar341 * fVar216);
            fVar202 = (fVar344 * fVar140 + 0.0) - (fVar153 * fVar213 + fVar341 * fVar236);
            fVar211 = (fVar344 * fVar150 + 0.0) - (fVar153 * fVar178 + fVar341 * fVar239);
            fVar213 = (fVar344 * 0.0 + 0.0) - fVar253;
            fVar153 = fVar202 * fVar202;
            fStack_600 = fVar211 * fVar211;
            fStack_5fc = fVar213 * fVar213;
            local_608._0_4_ = fVar153 + fVar200 * fVar200 + fStack_600;
            local_608._4_4_ = fVar153 + fVar153 + fStack_5fc;
            fStack_600 = fVar153 + fStack_600 + fStack_600;
            fStack_5fc = fVar153 + fStack_5fc + fStack_5fc;
            fVar153 = fVar151;
            if (fVar151 <= fVar175) {
              fVar153 = fVar175;
            }
            fVar178 = fVar237 * fVar237 + fVar234 * fVar234 + fVar250 * fVar250;
            auVar68 = ZEXT416((uint)fVar178);
            auVar158 = rsqrtss(ZEXT416((uint)fVar178),auVar68);
            fVar175 = auVar158._0_4_;
            fVar214 = fVar175 * 1.5 - fVar175 * fVar175 * fVar178 * 0.5 * fVar175;
            fVar288 = fVar234 * fVar214;
            fVar292 = fVar237 * fVar214;
            fVar298 = fVar250 * fVar214;
            fVar300 = fVar252 * fVar214;
            fVar275 = fVar250 * fVar154 + fVar237 * fVar173 + fVar234 * fVar156;
            auVar68 = rcpss(auVar68,auVar68);
            fVar175 = (2.0 - fVar178 * auVar68._0_4_) * auVar68._0_4_;
            fVar216 = fVar202 * fVar292;
            fVar236 = fVar211 * fVar298;
            fVar239 = fVar213 * fVar300;
            fVar281 = fVar216 + fVar200 * fVar288 + fVar236;
            fVar285 = fVar216 + fVar216 + fVar239;
            fVar236 = fVar216 + fVar236 + fVar236;
            fVar239 = fVar216 + fVar239 + fVar239;
            fVar216 = (SQRT((float)local_608._0_4_) + 1.0) * (fVar151 / SQRT(fVar178)) +
                      SQRT((float)local_608._0_4_) * fVar151 + fVar153;
            fVar301 = fVar300 * -fVar252;
            fVar175 = fVar298 * -fVar250 + fVar292 * -fVar237 + fVar288 * -fVar234 +
                      fVar175 * (fVar178 * fVar154 - fVar275 * fVar250) * fVar214 * fVar211 +
                      fVar175 * (fVar178 * fVar173 - fVar275 * fVar237) * fVar214 * fVar202 +
                      fVar175 * (fVar178 * fVar156 - fVar275 * fVar234) * fVar214 * fVar200;
            fVar178 = fVar150 * fVar298 + fVar140 * fVar292 + fVar105 * fVar288;
            fVar154 = (float)local_608._0_4_ - fVar281 * fVar281;
            auVar360._0_8_ = CONCAT44((float)local_608._4_4_ - fVar285 * fVar285,fVar154);
            auVar360._8_4_ = fStack_600 - fVar236 * fVar236;
            auVar360._12_4_ = fStack_5fc - fVar239 * fVar239;
            fVar173 = -fVar252 * fVar213;
            local_678 = CONCAT44(fVar301,fVar175);
            auVar132._8_4_ = auVar360._8_4_;
            auVar132._0_8_ = auVar360._0_8_;
            auVar132._12_4_ = auVar360._12_4_;
            auVar68 = rsqrtss(auVar132,auVar360);
            fVar156 = auVar68._0_4_;
            fVar156 = fVar156 * 1.5 - fVar156 * fVar156 * fVar154 * 0.5 * fVar156;
            if (fVar154 < 0.0) {
              fVar154 = sqrtf(fVar154);
              uVar57 = extraout_RAX_00;
              p_Var55 = extraout_RDX_00;
            }
            else {
              fVar154 = SQRT(fVar154);
            }
            fVar154 = fVar154 - fVar253;
            fVar214 = ((-fVar250 * fVar211 + -fVar237 * fVar202 + -fVar234 * fVar200) -
                      fVar281 * fVar175) * fVar156 - fVar252;
            fVar156 = ((fVar150 * fVar211 + fVar140 * fVar202 + fVar105 * fVar200) -
                      fVar281 * fVar178) * fVar156;
            auVar170._0_4_ = fVar175 * fVar156 - fVar178 * fVar214;
            auVar193._8_4_ = -fVar173;
            auVar193._0_8_ = CONCAT44(fVar173,fVar214) ^ 0x8000000000000000;
            auVar193._12_4_ = fVar213 * 0.0;
            auVar192._8_8_ = auVar193._8_8_;
            auVar192._0_8_ = CONCAT44(fVar156,fVar214) ^ 0x80000000;
            auVar170._4_4_ = auVar170._0_4_;
            auVar170._8_4_ = auVar170._0_4_;
            auVar170._12_4_ = auVar170._0_4_;
            auVar68 = divps(auVar192,auVar170);
            auVar248._8_4_ = fVar301;
            auVar248._0_8_ = local_678;
            auVar248._12_4_ = -(fVar300 * 0.0);
            auVar247._8_8_ = auVar248._8_8_;
            auVar247._0_8_ = CONCAT44(fVar178,fVar175) ^ 0x8000000000000000;
            auVar158 = divps(auVar247,auVar170);
            fVar344 = fVar344 - (fVar154 * auVar158._0_4_ + fVar281 * auVar68._0_4_);
            fVar341 = fVar341 - (fVar154 * auVar158._4_4_ + fVar281 * auVar68._4_4_);
          } while ((fVar216 <= ABS(fVar281)) ||
                  (auVar260._12_4_ * 1.9073486e-06 + fVar153 + fVar216 <= ABS(fVar154)));
          fVar344 = fVar196 + fVar344;
          if ((fVar142 <= fVar344) &&
             (((fVar151 = *(float *)(ray + k * 4 + 0x80), fVar344 <= fVar151 && (0.0 <= fVar341)) &&
              (fVar341 <= 1.0)))) {
            auVar68 = rsqrtss(_local_608,_local_608);
            fVar153 = auVar68._0_4_;
            pGVar9 = (context->scene->geometries).items[uVar61].ptr;
            uVar57 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar153 = fVar153 * 1.5 + fVar153 * fVar153 * (float)local_608._0_4_ * -0.5 * fVar153;
              fVar200 = fVar200 * fVar153;
              fVar202 = fVar202 * fVar153;
              fVar211 = fVar211 * fVar153;
              fVar153 = fVar252 * fVar200 + fVar234;
              fVar154 = fVar252 * fVar202 + fVar237;
              fVar156 = fVar252 * fVar211 + fVar250;
              fVar175 = fVar202 * fVar234 - fVar237 * fVar200;
              fVar202 = fVar211 * fVar237 - fVar250 * fVar202;
              fVar200 = fVar200 * fVar250 - fVar234 * fVar211;
              fVar173 = fVar154 * fVar202 - fVar200 * fVar153;
              fVar154 = fVar156 * fVar200 - fVar175 * fVar154;
              fVar153 = fVar153 * fVar175 - fVar202 * fVar156;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar344;
                *(float *)(ray + k * 4 + 0xc0) = fVar154;
                *(float *)(ray + k * 4 + 0xd0) = fVar153;
                *(float *)(ray + k * 4 + 0xe0) = fVar173;
                *(float *)(ray + k * 4 + 0xf0) = fVar341;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(int *)(ray + k * 4 + 0x110) = (int)local_5e0;
                *(uint *)(ray + k * 4 + 0x120) = uVar61;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar63 = context->user->instPrimID[0];
                uVar57 = (ulong)uVar63;
                *(uint *)(ray + k * 4 + 0x140) = uVar63;
              }
              else {
                local_388._4_4_ = fVar154;
                local_388._0_4_ = fVar154;
                fStack_380 = fVar154;
                fStack_37c = fVar154;
                local_378 = fVar153;
                fStack_374 = fVar153;
                fStack_370 = fVar153;
                fStack_36c = fVar153;
                local_368 = fVar173;
                fStack_364 = fVar173;
                fStack_360 = fVar173;
                fStack_35c = fVar173;
                local_358 = fVar341;
                fStack_354 = fVar341;
                fStack_350 = fVar341;
                fStack_34c = fVar341;
                local_348 = 0;
                uStack_340 = 0;
                local_338 = CONCAT44(uVar62,uVar62);
                uStack_330 = CONCAT44(uVar62,uVar62);
                local_328 = CONCAT44(uVar61,uVar61);
                uStack_320 = CONCAT44(uVar61,uVar61);
                local_318 = context->user->instID[0];
                uStack_314 = local_318;
                uStack_310 = local_318;
                uStack_30c = local_318;
                local_308 = context->user->instPrimID[0];
                uStack_304 = local_308;
                uStack_300 = local_308;
                uStack_2fc = local_308;
                *(float *)(ray + k * 4 + 0x80) = fVar344;
                local_5f8 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_5f8;
                args.geometryUserPtr = pGVar9->userPtr;
                args.context = context->user;
                args.ray = (RTCRayN *)ray;
                args.hit = (RTCHitN *)local_388;
                args.N = 4;
                p_Var55 = pGVar9->intersectionFilterN;
                auVar366._8_8_ = &local_318;
                auVar366._0_8_ = p_Var55;
                if (p_Var55 != (RTCFilterFunctionN)0x0) {
                  auVar366 = (*p_Var55)(&args);
                }
                p_Var55 = auVar366._8_8_;
                auVar133._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                auVar133._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                auVar133._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                auVar133._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                uVar63 = movmskps(auVar366._0_4_,auVar133);
                pRVar52 = (RTCRayN *)(ulong)(uVar63 ^ 0xf);
                if ((uVar63 ^ 0xf) == 0) {
                  auVar133 = auVar133 ^ _DAT_01f46b70;
                }
                else {
                  p_Var59 = context->args->filter;
                  auVar45._8_8_ = p_Var55;
                  auVar45._0_8_ = p_Var59;
                  auVar367._8_8_ = p_Var55;
                  auVar367._0_8_ = p_Var59;
                  if ((p_Var59 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (auVar367 = auVar45, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar367 = (*p_Var59)(&args);
                  }
                  p_Var55 = auVar367._8_8_;
                  auVar98._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                  auVar98._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                  auVar98._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                  auVar98._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                  auVar133 = auVar98 ^ _DAT_01f46b70;
                  uVar63 = movmskps(auVar367._0_4_,auVar98);
                  pRVar52 = (RTCRayN *)(ulong)(uVar63 ^ 0xf);
                  if ((uVar63 ^ 0xf) != 0) {
                    uVar63 = *(uint *)(args.hit + 4);
                    uVar65 = *(uint *)(args.hit + 8);
                    uVar64 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar98._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar98._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0xc4) & auVar98._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 200) & auVar98._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0xcc) & auVar98._12_4_;
                    uVar63 = *(uint *)(args.hit + 0x14);
                    uVar65 = *(uint *)(args.hit + 0x18);
                    uVar64 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar98._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0xd4) & auVar98._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 0xd8) & auVar98._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0xdc) & auVar98._12_4_;
                    uVar63 = *(uint *)(args.hit + 0x24);
                    uVar65 = *(uint *)(args.hit + 0x28);
                    uVar64 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar98._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0xe4) & auVar98._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 0xe8) & auVar98._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0xec) & auVar98._12_4_;
                    uVar63 = *(uint *)(args.hit + 0x34);
                    uVar65 = *(uint *)(args.hit + 0x38);
                    uVar64 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar98._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0xf4) & auVar98._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 0xf8) & auVar98._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0xfc) & auVar98._12_4_;
                    uVar63 = *(uint *)(args.hit + 0x44);
                    uVar65 = *(uint *)(args.hit + 0x48);
                    uVar64 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar98._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0x104) & auVar98._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 0x108) & auVar98._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0x10c) & auVar98._12_4_;
                    uVar63 = *(uint *)(args.hit + 0x54);
                    uVar65 = *(uint *)(args.hit + 0x58);
                    uVar64 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar98._0_4_ |
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar98._4_4_ | ~auVar98._4_4_ & uVar63;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar98._8_4_ | ~auVar98._8_4_ & uVar65;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar98._12_4_ | ~auVar98._12_4_ & uVar64;
                    uVar63 = *(uint *)(args.hit + 100);
                    uVar65 = *(uint *)(args.hit + 0x68);
                    uVar64 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar98._0_4_ |
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar98._4_4_ | ~auVar98._4_4_ & uVar63;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar98._8_4_ | ~auVar98._8_4_ & uVar65;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar98._12_4_ | ~auVar98._12_4_ & uVar64;
                    uVar63 = *(uint *)(args.hit + 0x74);
                    uVar65 = *(uint *)(args.hit + 0x78);
                    uVar64 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar98._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar98._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar98._4_4_ & uVar63 | *(uint *)(args.ray + 0x134) & auVar98._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar98._8_4_ & uVar65 | *(uint *)(args.ray + 0x138) & auVar98._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar98._12_4_ & uVar64 | *(uint *)(args.ray + 0x13c) & auVar98._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar98 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar98;
                    pRVar52 = args.ray;
                  }
                }
                auVar134._0_4_ = auVar133._0_4_ << 0x1f;
                auVar134._4_4_ = auVar133._4_4_ << 0x1f;
                auVar134._8_4_ = auVar133._8_4_ << 0x1f;
                auVar134._12_4_ = auVar133._12_4_ << 0x1f;
                iVar47 = movmskps((int)pRVar52,auVar134);
                uVar57 = CONCAT44((int)((ulong)pRVar52 >> 0x20),iVar47);
                if (iVar47 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar151;
                }
              }
            }
          }
LAB_0031b74e:
          fVar318 = *(float *)(ray + k * 4 + 0x80);
          auVar96._0_4_ = -(uint)(fVar327 <= fVar318) & local_3a8._0_4_;
          auVar96._4_4_ = -(uint)(fVar330 <= fVar318) & local_3a8._4_4_;
          auVar96._8_4_ = -(uint)(fVar333 <= fVar318) & local_3a8._8_4_;
          auVar96._12_4_ = -(uint)(fVar338 <= fVar318) & local_3a8._12_4_;
          auVar189 = auVar162;
        }
        auVar209._0_4_ = auVar146._0_4_ & auVar189._0_4_ & -(uint)(fVar196 + fVar179 <= fVar318);
        auVar209._4_4_ = auVar146._4_4_ & auVar189._4_4_ & -(uint)(fVar196 + fVar197 <= fVar318);
        auVar209._8_4_ = auVar146._8_4_ & auVar189._8_4_ & -(uint)(fVar196 + fVar199 <= fVar318);
        auVar209._12_4_ = auVar146._12_4_ & auVar189._12_4_ & -(uint)(fVar196 + fVar176 <= fVar318);
        auVar194._0_4_ =
             auVar95._0_4_ & auVar148._0_4_ & -(uint)(fVar196 + tp1.lower.field_0.v[0] <= fVar318);
        auVar194._4_4_ =
             auVar95._4_4_ & auVar148._4_4_ & -(uint)(fVar196 + tp1.lower.field_0.v[1] <= fVar318);
        auVar194._8_4_ =
             auVar95._8_4_ & auVar148._8_4_ & -(uint)(fVar196 + tp1.lower.field_0.v[2] <= fVar318);
        auVar194._12_4_ =
             auVar95._12_4_ & auVar148._12_4_ & -(uint)(fVar196 + tp1.lower.field_0.v[3] <= fVar318)
        ;
        uVar63 = movmskps(0,auVar194 | auVar209);
        uVar57 = (ulong)uVar63;
        auVar68 = _DAT_01f46a60;
        if (uVar63 != 0) {
          uVar57 = (long)p_Var54 * 0x30;
          stack[(long)p_Var54].valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar194 | auVar209);
          stack[(long)p_Var54].tlower.field_0.i[0] =
               ~auVar209._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar179 & auVar209._0_4_;
          stack[(long)p_Var54].tlower.field_0.i[1] =
               ~auVar209._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar197 & auVar209._4_4_;
          stack[(long)p_Var54].tlower.field_0.i[2] =
               ~auVar209._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar199 & auVar209._8_4_;
          stack[(long)p_Var54].tlower.field_0.i[3] =
               ~auVar209._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar176 & auVar209._12_4_;
          stack[(long)p_Var54].u0 = fVar152;
          stack[(long)p_Var54].u1 = fVar155;
          stack[(long)p_Var54].depth = local_6ac + 1;
          p_Var54 = (RTCFilterFunctionN)(ulong)((int)p_Var54 + 1);
        }
      }
    }
    do {
      p_Var59 = p_Var54;
      iVar47 = (int)p_Var59;
      if (iVar47 == 0) {
        fVar105 = *(float *)(ray + k * 4 + 0x80);
        auVar138._4_4_ = -(uint)(fVar67 <= fVar105);
        auVar138._0_4_ = -(uint)(fVar174 <= fVar105);
        auVar138._8_4_ = -(uint)(fVar101 <= fVar105);
        auVar138._12_4_ = -(uint)(fVar102 <= fVar105);
        uVar61 = movmskps((int)uVar57,auVar138);
        uVar61 = (uint)uVar58 & uVar61;
        goto LAB_003192d2;
      }
      p_Var54 = (RTCFilterFunctionN)(ulong)(iVar47 - 1U);
      uVar57 = (long)p_Var54 * 0x30;
      fVar155 = stack[(long)p_Var54].tlower.field_0.v[0];
      fVar327 = stack[(long)p_Var54].tlower.field_0.v[1];
      fVar330 = stack[(long)p_Var54].tlower.field_0.v[2];
      fVar333 = stack[(long)p_Var54].tlower.field_0.v[3];
      fVar152 = *(float *)(ray + k * 4 + 0x80);
      aVar99._0_4_ = -(uint)(fVar196 + fVar155 <= fVar152) & stack[(long)p_Var54].valid.field_0.i[0]
      ;
      aVar99._4_4_ = -(uint)(fVar196 + fVar327 <= fVar152) & stack[(long)p_Var54].valid.field_0.i[1]
      ;
      aVar99.i[2] = -(uint)(fVar196 + fVar330 <= fVar152) & stack[(long)p_Var54].valid.field_0.i[2];
      aVar99.i[3] = -(uint)(fVar196 + fVar333 <= fVar152) & stack[(long)p_Var54].valid.field_0.i[3];
      _local_388 = aVar99;
      uVar63 = movmskps((int)p_Var55,(undefined1  [16])aVar99);
      p_Var55 = (RTCFilterFunctionN)(ulong)uVar63;
    } while (uVar63 == 0);
    auVar135._0_4_ = (uint)fVar155 & aVar99._0_4_;
    auVar135._4_4_ = (uint)fVar327 & aVar99._4_4_;
    auVar135._8_4_ = (uint)fVar330 & aVar99.i[2];
    auVar135._12_4_ = (uint)fVar333 & aVar99.i[3];
    auVar149._0_8_ = CONCAT44(~aVar99._4_4_,~aVar99._0_4_) & 0x7f8000007f800000;
    auVar149._8_4_ = ~aVar99.i[2] & 0x7f800000;
    auVar149._12_4_ = ~aVar99.i[3] & 0x7f800000;
    auVar149 = auVar149 | auVar135;
    auVar171._4_4_ = auVar149._0_4_;
    auVar171._0_4_ = auVar149._4_4_;
    auVar171._8_4_ = auVar149._12_4_;
    auVar171._12_4_ = auVar149._8_4_;
    auVar158 = minps(auVar171,auVar149);
    auVar136._0_8_ = auVar158._8_8_;
    auVar136._8_4_ = auVar158._0_4_;
    auVar136._12_4_ = auVar158._4_4_;
    auVar158 = minps(auVar136,auVar158);
    auVar137._0_8_ =
         CONCAT44(-(uint)(auVar158._4_4_ == auVar149._4_4_) & aVar99._4_4_,
                  -(uint)(auVar158._0_4_ == auVar149._0_4_) & aVar99._0_4_);
    auVar137._8_4_ = -(uint)(auVar158._8_4_ == auVar149._8_4_) & aVar99.i[2];
    auVar137._12_4_ = -(uint)(auVar158._12_4_ == auVar149._12_4_) & aVar99.i[3];
    iVar53 = movmskps(iVar47 - 1U,auVar137);
    if (iVar53 != 0) {
      aVar99.i[2] = auVar137._8_4_;
      aVar99._0_8_ = auVar137._0_8_;
      aVar99.i[3] = auVar137._12_4_;
    }
    pSVar50 = stack + (long)p_Var54;
    uVar63 = movmskps(iVar53,(undefined1  [16])aVar99);
    lVar56 = 0;
    if (uVar63 != 0) {
      for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
      }
    }
    *(undefined4 *)(local_388 + lVar56 * 4) = 0;
    uVar6 = stack[(long)p_Var54].u0;
    uVar7 = stack[(long)p_Var54].u1;
    local_6ac = stack[(long)p_Var54].depth;
    iVar53 = movmskps(local_6ac,(undefined1  [16])_local_388);
    p_Var55 = (RTCFilterFunctionN)(ulong)(iVar47 - 1);
    if (iVar53 != 0) {
      p_Var55 = p_Var59;
    }
    (pSVar50->valid).field_0 = _local_388;
    fVar152 = (float)uVar7 - (float)uVar6;
    args.valid = (int *)CONCAT44(fVar152 * 0.33333334 + (float)uVar6,fVar152 * 0.0 + (float)uVar6);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar152 * 1.0 + (float)uVar6,fVar152 * 0.6666667 + (float)uVar6);
    fVar152 = *(float *)(local_5a8 + lVar56 * 4 + -0x30);
    fVar155 = *(float *)(local_5a8 + lVar56 * 4 + -0x2c);
    p_Var54 = p_Var55;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }